

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  ImVec2 *pIVar1;
  ImVector<ImGuiKeyRoutingData> *pIVar2;
  int *piVar3;
  ImS8 *pIVar4;
  ImDrawListFlags *pIVar5;
  float *pfVar6;
  ImU16 *pIVar7;
  short sVar8;
  ImGuiInputSource IVar9;
  ImGuiContextHook *pIVar10;
  uint *puVar11;
  ImGuiViewportP *pIVar12;
  ImGuiInputEvent *pIVar13;
  ImGuiKeyRoutingData *pIVar14;
  ImGuiTableTempData *pIVar15;
  ImGuiWindowStackData *pIVar16;
  ImGuiPopupData *pIVar17;
  int *piVar18;
  ImGuiGroupData *pIVar19;
  ImGuiStackLevelInfo *pIVar20;
  undefined8 uVar21;
  ImGuiContext *pIVar22;
  ImGuiContext *pIVar23;
  ImU16 IVar24;
  undefined3 uVar25;
  ImGuiID IVar26;
  byte bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  ImU8 IVar31;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 uVar32;
  ImGuiContext *g_6;
  uint *__dest;
  ImGuiInputEvent *__dest_00;
  ImGuiKeyData *pIVar33;
  bool *pbVar34;
  ImGuiKeyRoutingData *pIVar35;
  ImGuiKeyRoutingData *__dest_01;
  ImGuiWindow *pIVar36;
  ImGuiWindow *extraout_RAX;
  ImGuiWindow *pIVar37;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  ImGuiWindowStackData *__dest_02;
  ImGuiPopupData *__dest_03;
  int *piVar38;
  ImGuiGroupData *__dest_04;
  ImGuiStackLevelInfo *__dest_05;
  int n;
  uint uVar39;
  int iVar40;
  int iVar41;
  ImGuiScrollFlags scroll_flags;
  ulong uVar42;
  ImGuiWindow *window;
  undefined2 uVar43;
  int i;
  ImGuiID IVar44;
  ImGuiContext *g_1;
  long lVar45;
  ImRect *pIVar46;
  ImGuiContext *g_11;
  ImGuiContext *pIVar47;
  int iVar48;
  char *pcVar49;
  ImGuiNavLayer IVar50;
  ImFont *font;
  ulong uVar51;
  ImGui *this;
  ImGuiContext *g;
  int iVar52;
  ImGuiWindow *parent_window;
  long lVar53;
  byte bVar54;
  ImGuiWindow *child_window;
  long lVar55;
  bool bVar56;
  bool bVar57;
  uint uVar58;
  uint uVar59;
  float fVar60;
  float fVar61;
  ImVec2 IVar62;
  ImVec2 IVar63;
  ImVec2 IVar64;
  ImVec2 IVar65;
  ImVec2 IVar66;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar67 [16];
  ImVec2 IVar68;
  ImVec2 IVar69;
  undefined1 auVar70 [16];
  float fVar71;
  ImVec2 IVar72;
  ImVec2 IVar73;
  float fVar76;
  float fVar77;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar78;
  float fVar79;
  float fVar83;
  ImVec2 IVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float scale;
  float fVar84;
  ImGuiContext *ctx;
  float local_b8;
  float local_a8;
  float fStack_a4;
  ImRect local_88;
  ImGuiContext *local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ImVec2 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pIVar22 = GImGui;
  lVar45 = (long)(GImGui->Hooks).Size;
  if (0 < lVar45) {
    lVar53 = -lVar45;
    lVar55 = lVar45 + 1;
    lVar45 = lVar45 * 0x20;
    do {
      pIVar10 = (pIVar22->Hooks).Data;
      if (*(int *)(pIVar10 + lVar45 + -0x1c) == 7) {
        memmove(pIVar10 + lVar45 + -0x20,pIVar10 + lVar45,((pIVar22->Hooks).Size + lVar53) * 0x20);
        (pIVar22->Hooks).Size = (pIVar22->Hooks).Size + -1;
      }
      lVar53 = lVar53 + 1;
      lVar55 = lVar55 + -1;
      lVar45 = lVar45 + -0x20;
    } while (1 < lVar55);
  }
  if (0 < (pIVar22->Hooks).Size) {
    lVar45 = 0;
    lVar55 = 0;
    do {
      pIVar10 = (pIVar22->Hooks).Data;
      if (*(int *)(pIVar10 + lVar45 + 4) == 0) {
        (**(code **)(pIVar10 + lVar45 + 0x10))(pIVar22,pIVar10 + lVar45);
      }
      lVar55 = lVar55 + 1;
      lVar45 = lVar45 + 0x20;
    } while (lVar55 < (pIVar22->Hooks).Size);
  }
  pIVar23 = GImGui;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar23->SettingsLoaded == false) {
    pcVar49 = (pIVar23->IO).IniFilename;
    if (pcVar49 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar49);
    }
    pIVar23->SettingsLoaded = true;
  }
  if ((0.0 < pIVar23->SettingsDirtyTimer) &&
     (fVar60 = pIVar23->SettingsDirtyTimer - (pIVar23->IO).DeltaTime,
     pIVar23->SettingsDirtyTimer = fVar60, fVar60 <= 0.0)) {
    pcVar49 = (pIVar23->IO).IniFilename;
    if (pcVar49 == (char *)0x0) {
      (pIVar23->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar49);
    }
    pIVar23->SettingsDirtyTimer = 0.0;
  }
  pIVar22->Time = (double)(pIVar22->IO).DeltaTime + pIVar22->Time;
  pIVar22->WithinFrameScope = true;
  pIVar22->FrameCount = pIVar22->FrameCount + 1;
  pIVar22->TooltipOverrideCount = 0;
  pIVar22->WindowsActiveCount = 0;
  iVar41 = (pIVar22->MenusIdSubmittedThisFrame).Capacity;
  if (iVar41 < 0) {
    uVar39 = iVar41 / 2 + iVar41;
    uVar42 = 0;
    if (0 < (int)uVar39) {
      uVar42 = (ulong)uVar39;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar18 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar18 = *piVar18 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)(uVar42 * 4,GImAllocatorUserData);
    puVar11 = (pIVar22->MenusIdSubmittedThisFrame).Data;
    if (puVar11 != (uint *)0x0) {
      memcpy(__dest,puVar11,(long)(pIVar22->MenusIdSubmittedThisFrame).Size << 2);
      puVar11 = (pIVar22->MenusIdSubmittedThisFrame).Data;
      if ((puVar11 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar18 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar18 = *piVar18 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar11,GImAllocatorUserData);
    }
    (pIVar22->MenusIdSubmittedThisFrame).Data = __dest;
    (pIVar22->MenusIdSubmittedThisFrame).Capacity = (int)uVar42;
  }
  (pIVar22->MenusIdSubmittedThisFrame).Size = 0;
  fVar60 = (pIVar22->IO).DeltaTime;
  pIVar22->FramerateSecPerFrameAccum =
       (fVar60 - pIVar22->FramerateSecPerFrame[pIVar22->FramerateSecPerFrameIdx]) +
       pIVar22->FramerateSecPerFrameAccum;
  pIVar22->FramerateSecPerFrame[pIVar22->FramerateSecPerFrameIdx] = fVar60;
  iVar41 = pIVar22->FramerateSecPerFrameIdx;
  iVar48 = (int)((ulong)((long)(iVar41 + 1) * -0x77777777) >> 0x20) + iVar41 + 1;
  iVar52 = 0x3b;
  if (pIVar22->FramerateSecPerFrameCount < 0x3b) {
    iVar52 = pIVar22->FramerateSecPerFrameCount;
  }
  pIVar22->FramerateSecPerFrameIdx = iVar41 + ((iVar48 >> 5) - (iVar48 >> 0x1f)) * -0x3c + 1;
  pIVar22->FramerateSecPerFrameCount = iVar52 + 1;
  uVar39 = -(uint)(0.0 < pIVar22->FramerateSecPerFrameAccum);
  (pIVar22->IO).Framerate =
       (float)(~uVar39 & 0x7f7fffff |
              (uint)(1.0 / (pIVar22->FramerateSecPerFrameAccum / (float)(iVar52 + 1))) & uVar39);
  pIVar23 = GImGui;
  pIVar12 = *(GImGui->Viewports).Data;
  (pIVar12->super_ImGuiViewport).Flags = 5;
  (pIVar12->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar12->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar12->super_ImGuiViewport).Size = (pIVar23->IO).DisplaySize;
  if (0 < (pIVar23->Viewports).Size) {
    lVar45 = 0;
    do {
      pIVar12 = (pIVar23->Viewports).Data[lVar45];
      pIVar12->WorkOffsetMin = pIVar12->BuildWorkOffsetMin;
      pIVar12->WorkOffsetMax = pIVar12->BuildWorkOffsetMax;
      (pIVar12->BuildWorkOffsetMin).x = 0.0;
      (pIVar12->BuildWorkOffsetMin).y = 0.0;
      (pIVar12->BuildWorkOffsetMax).x = 0.0;
      (pIVar12->BuildWorkOffsetMax).y = 0.0;
      IVar64 = (pIVar12->super_ImGuiViewport).Pos;
      IVar62 = (pIVar12->super_ImGuiViewport).Size;
      fVar60 = (pIVar12->WorkOffsetMin).x;
      IVar68.x = IVar64.x + fVar60;
      fVar76 = (pIVar12->WorkOffsetMin).y;
      IVar68.y = IVar64.y + fVar76;
      fVar60 = (IVar62.x - fVar60) + (pIVar12->WorkOffsetMax).x;
      fVar76 = (IVar62.y - fVar76) + (pIVar12->WorkOffsetMax).y;
      (pIVar12->super_ImGuiViewport).WorkPos = IVar68;
      (pIVar12->super_ImGuiViewport).WorkSize.x = (float)(-(uint)(0.0 < fVar60) & (uint)fVar60);
      (pIVar12->super_ImGuiViewport).WorkSize.y = (float)(-(uint)(0.0 < fVar76) & (uint)fVar76);
      lVar45 = lVar45 + 1;
    } while (lVar45 < (pIVar23->Viewports).Size);
  }
  ((pIVar22->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    font = *(((GImGui->IO).Fonts)->Fonts).Data;
  }
  SetCurrentFont(font);
  lVar45 = (long)(pIVar22->Viewports).Size;
  if (lVar45 < 1) {
    fVar60 = 3.4028235e+38;
    fVar76 = 3.4028235e+38;
    fVar78 = -3.4028235e+38;
    fVar84 = -3.4028235e+38;
  }
  else {
    fVar60 = 3.4028235e+38;
    fVar76 = 3.4028235e+38;
    fVar84 = -3.4028235e+38;
    lVar55 = 0;
    do {
      pIVar12 = (pIVar22->Viewports).Data[lVar55];
      IVar64 = (pIVar12->super_ImGuiViewport).Pos;
      IVar62 = (pIVar12->super_ImGuiViewport).Size;
      fVar71 = IVar64.x;
      fVar78 = IVar62.x + fVar71;
      fVar77 = IVar64.y;
      fVar83 = IVar62.y + fVar77;
      uVar39 = -(uint)(fVar84 < fVar83);
      fVar78 = (float)((uint)fVar78 & -(uint)(0.0 < fVar78));
      fVar60 = (float)(~-(uint)(fVar71 < fVar60) & (uint)fVar60 |
                      (uint)fVar71 & -(uint)(fVar71 < fVar60));
      fVar76 = (float)(~-(uint)(fVar77 < fVar76) & (uint)fVar76 |
                      (uint)fVar77 & -(uint)(fVar77 < fVar76));
      fVar84 = (float)(~uVar39 & (uint)fVar84 | (uint)fVar83 & uVar39);
      lVar55 = lVar55 + 1;
    } while (lVar45 != lVar55);
  }
  (pIVar22->DrawListSharedData).ClipRectFullscreen.x = fVar60;
  (pIVar22->DrawListSharedData).ClipRectFullscreen.y = fVar76;
  (pIVar22->DrawListSharedData).ClipRectFullscreen.z = fVar78;
  (pIVar22->DrawListSharedData).ClipRectFullscreen.w = fVar84;
  fVar60 = (pIVar22->Style).CircleTessellationMaxError;
  (pIVar22->DrawListSharedData).CurveTessellationTol = (pIVar22->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&pIVar22->DrawListSharedData,fVar60);
  uVar39 = (uint)(pIVar22->Style).AntiAliasedLines;
  (pIVar22->DrawListSharedData).InitialFlags = uVar39;
  if (((pIVar22->Style).AntiAliasedLinesUseTex != false) &&
     ((pIVar22->Font->ContainerAtlas->Flags & 4) == 0)) {
    (pIVar22->DrawListSharedData).InitialFlags = uVar39 | 2;
  }
  if ((pIVar22->Style).AntiAliasedFill == true) {
    pIVar5 = &(pIVar22->DrawListSharedData).InitialFlags;
    *(byte *)pIVar5 = (byte)*pIVar5 | 4;
  }
  if (((pIVar22->IO).BackendFlags & 8) != 0) {
    pIVar5 = &(pIVar22->DrawListSharedData).InitialFlags;
    *(byte *)pIVar5 = (byte)*pIVar5 | 8;
  }
  if (0 < (pIVar22->Viewports).Size) {
    lVar45 = 0;
    do {
      pIVar12 = (pIVar22->Viewports).Data[lVar45];
      (pIVar12->DrawDataP).DisplaySize.x = 0.0;
      (pIVar12->DrawDataP).DisplaySize.y = 0.0;
      (pIVar12->DrawDataP).FramebufferScale.x = 0.0;
      (pIVar12->DrawDataP).FramebufferScale.y = 0.0;
      (pIVar12->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar12->DrawDataP).DisplayPos.x = 0.0;
      (pIVar12->DrawDataP).DisplayPos.y = 0.0;
      (pIVar12->DrawDataP).Valid = false;
      *(undefined3 *)&(pIVar12->DrawDataP).field_0x1 = 0;
      (pIVar12->DrawDataP).CmdListsCount = 0;
      (pIVar12->DrawDataP).TotalIdxCount = 0;
      (pIVar12->DrawDataP).TotalVtxCount = 0;
      lVar45 = lVar45 + 1;
    } while (lVar45 < (pIVar22->Viewports).Size);
  }
  pIVar23 = GImGui;
  if ((pIVar22->DragDropActive != false) &&
     (IVar44 = (pIVar22->DragDropPayload).SourceId, IVar44 == pIVar22->ActiveId)) {
    if (GImGui->ActiveId == IVar44) {
      GImGui->ActiveIdIsAlive = IVar44;
    }
    if (pIVar23->ActiveIdPreviousFrame == IVar44) {
      pIVar23->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar22->HoveredIdPreviousFrame == 0) {
    pIVar22->HoveredIdTimer = 0.0;
  }
  if ((pIVar22->HoveredIdPreviousFrame == 0) ||
     ((pIVar22->HoveredId != 0 && (pIVar22->ActiveId == pIVar22->HoveredId)))) {
    pIVar22->HoveredIdNotActiveTimer = 0.0;
  }
  if (pIVar22->HoveredId != 0) {
    pIVar22->HoveredIdTimer = (pIVar22->IO).DeltaTime + pIVar22->HoveredIdTimer;
  }
  if ((pIVar22->HoveredId != 0) && (pIVar22->ActiveId != pIVar22->HoveredId)) {
    pIVar22->HoveredIdNotActiveTimer = (pIVar22->IO).DeltaTime + pIVar22->HoveredIdNotActiveTimer;
  }
  IVar44 = pIVar22->ActiveId;
  pIVar22->HoveredIdPreviousFrame = pIVar22->HoveredId;
  pIVar22->HoveredId = 0;
  pIVar22->HoveredIdAllowOverlap = false;
  pIVar22->HoveredIdDisabled = false;
  if (((IVar44 != 0) && (pIVar22->ActiveIdIsAlive != IVar44)) &&
     (pIVar22->ActiveIdPreviousFrame == IVar44)) {
    if ((pIVar22->DebugLogFlags & 1) != 0) {
      DebugLog("NewFrame(): ClearActiveID() because it isn\'t marked alive anymore!\n");
    }
    SetActiveID(0,(ImGuiWindow *)0x0);
  }
  if (pIVar22->ActiveId != 0) {
    pIVar22->ActiveIdTimer = (pIVar22->IO).DeltaTime + pIVar22->ActiveIdTimer;
  }
  pIVar22->LastActiveIdTimer = (pIVar22->IO).DeltaTime + pIVar22->LastActiveIdTimer;
  pIVar22->ActiveIdPreviousFrame = pIVar22->ActiveId;
  pIVar22->ActiveIdPreviousFrameWindow = pIVar22->ActiveIdWindow;
  pIVar22->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar22->ActiveIdHasBeenEditedBefore;
  pIVar22->ActiveIdIsAlive = 0;
  pIVar22->ActiveIdHasBeenEditedThisFrame = false;
  pIVar22->ActiveIdPreviousFrameIsAlive = false;
  pIVar22->ActiveIdIsJustActivated = false;
  if (pIVar22->ActiveId != pIVar22->TempInputId && pIVar22->TempInputId != 0) {
    pIVar22->TempInputId = 0;
  }
  if (pIVar22->ActiveId == 0) {
    pIVar22->ActiveIdUsingNavDirMask = 0;
    pIVar22->ActiveIdUsingAllKeyboardKeys = false;
    pIVar22->ActiveIdUsingNavInputMask = 0;
  }
  pIVar23 = GImGui;
  IVar44 = pIVar22->ActiveId;
  if (IVar44 == 0) {
    pIVar22->ActiveIdUsingNavInputMask = 0;
  }
  else if ((pIVar22->ActiveIdUsingNavInputMask & 2) != 0) {
    GImGui->KeysOwnerData[0xe].OwnerNext = IVar44;
    pIVar23->KeysOwnerData[0xe].OwnerCurr = IVar44;
    pIVar23->KeysOwnerData[0xe].LockThisFrame = false;
    pIVar23->KeysOwnerData[0xe].LockUntilRelease = false;
  }
  pIVar22->HoverDelayIdPreviousFrame = pIVar22->HoverDelayId;
  if (pIVar22->HoverDelayId == 0) {
    if (0.0 < pIVar22->HoverDelayTimer) {
      fVar60 = (pIVar22->IO).DeltaTime;
      fVar84 = pIVar22->HoverDelayClearTimer + fVar60;
      pIVar22->HoverDelayClearTimer = fVar84;
      fVar76 = 0.2;
      if (0.2 <= fVar60 + fVar60) {
        fVar76 = fVar60 + fVar60;
      }
      if (fVar76 <= fVar84) {
        pIVar22->HoverDelayTimer = 0.0;
        pIVar22->HoverDelayClearTimer = 0.0;
      }
    }
  }
  else {
    pIVar22->HoverDelayTimer = (pIVar22->IO).DeltaTime + pIVar22->HoverDelayTimer;
    pIVar22->HoverDelayClearTimer = 0.0;
    pIVar22->HoverDelayId = 0;
  }
  pIVar22->DragDropAcceptIdPrev = pIVar22->DragDropAcceptIdCurr;
  pIVar22->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar22->DragDropAcceptIdCurr = 0;
  pIVar22->DragDropWithinSource = false;
  pIVar22->DragDropWithinTarget = false;
  pIVar22->DragDropHoldJustPressedId = 0;
  iVar41 = (pIVar22->InputEventsTrail).Capacity;
  if (iVar41 < 0) {
    uVar39 = iVar41 / 2 + iVar41;
    uVar42 = 0;
    if (0 < (int)uVar39) {
      uVar42 = (ulong)uVar39;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar18 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar18 = *piVar18 + 1;
    }
    __dest_00 = (ImGuiInputEvent *)(*GImAllocatorAllocFunc)(uVar42 * 0x18,GImAllocatorUserData);
    pIVar13 = (pIVar22->InputEventsTrail).Data;
    if (pIVar13 != (ImGuiInputEvent *)0x0) {
      memcpy(__dest_00,pIVar13,(long)(pIVar22->InputEventsTrail).Size * 0x18);
      pIVar13 = (pIVar22->InputEventsTrail).Data;
      if ((pIVar13 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar18 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar18 = *piVar18 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar13,GImAllocatorUserData);
    }
    (pIVar22->InputEventsTrail).Data = __dest_00;
    (pIVar22->InputEventsTrail).Capacity = (int)uVar42;
  }
  (pIVar22->InputEventsTrail).Size = 0;
  UpdateInputEvents((pIVar22->IO).ConfigInputTrickleEventQueue);
  pIVar23 = GImGui;
  if ((GImGui->IO).BackendUsingLegacyKeyArrays != '\0') {
    lVar45 = 0;
    do {
      lVar55 = (long)(pIVar23->IO).KeyMap[lVar45 + 0x200];
      if (lVar55 != -1) {
        (pIVar23->IO).KeyMap[lVar55] = (int)lVar45 + 0x200;
      }
      lVar45 = lVar45 + 1;
    } while (lVar45 != 0x8c);
    uVar42 = 0;
    do {
      bVar56 = (pIVar23->IO).KeysDown[uVar42];
      if ((bVar56 != false) || ((pIVar23->IO).BackendUsingLegacyKeyArrays == '\x01')) {
        uVar39 = (pIVar23->IO).KeyMap[uVar42];
        uVar51 = uVar42 & 0xffffffff;
        if (uVar39 != 0xffffffff) {
          uVar51 = (ulong)uVar39;
        }
        (pIVar23->IO).KeysData[(int)uVar51].Down = bVar56;
        if (uVar42 != uVar51) {
          (pIVar23->IO).KeysDown[(int)uVar51] = (pIVar23->IO).KeysDown[uVar42];
        }
        (pIVar23->IO).BackendUsingLegacyKeyArrays = '\x01';
      }
      pIVar47 = GImGui;
      uVar42 = uVar42 + 1;
    } while (uVar42 != 0x200);
    if ((pIVar23->IO).BackendUsingLegacyKeyArrays == '\x01') {
      (GImGui->IO).KeysData[0x288].Down = (pIVar23->IO).KeyCtrl;
      (pIVar47->IO).KeysData[0x289].Down = (pIVar23->IO).KeyShift;
      (pIVar47->IO).KeysData[0x28a].Down = (pIVar23->IO).KeyAlt;
      (pIVar47->IO).KeysData[0x28b].Down = (pIVar23->IO).KeySuper;
    }
  }
  bVar56 = true;
  if (((pIVar23->IO).ConfigFlags & 2) != 0) {
    bVar56 = ((pIVar23->IO).BackendFlags & 1) == 0;
  }
  if (((pIVar23->IO).BackendUsingLegacyNavInputArray == true) && (!bVar56)) {
    fVar60 = (pIVar23->IO).NavInputs[0];
    fVar76 = (pIVar23->IO).NavInputs[1];
    (pIVar23->IO).KeysData[0x26e].Down = 0.0 < fVar60;
    (pIVar23->IO).KeysData[0x26e].AnalogValue = fVar60;
    (pIVar23->IO).KeysData[0x26c].Down = 0.0 < fVar76;
    (pIVar23->IO).KeysData[0x26c].AnalogValue = fVar76;
    fVar60 = (pIVar23->IO).NavInputs[3];
    (pIVar23->IO).KeysData[0x26b].Down = 0.0 < fVar60;
    (pIVar23->IO).KeysData[0x26b].AnalogValue = fVar60;
    fVar60 = (pIVar23->IO).NavInputs[2];
    (pIVar23->IO).KeysData[0x26d].Down = 0.0 < fVar60;
    (pIVar23->IO).KeysData[0x26d].AnalogValue = fVar60;
    fVar60 = (pIVar23->IO).NavInputs[4];
    (pIVar23->IO).KeysData[0x26f].Down = 0.0 < fVar60;
    (pIVar23->IO).KeysData[0x26f].AnalogValue = fVar60;
    fVar60 = (pIVar23->IO).NavInputs[5];
    (pIVar23->IO).KeysData[0x270].Down = 0.0 < fVar60;
    (pIVar23->IO).KeysData[0x270].AnalogValue = fVar60;
    fVar60 = (pIVar23->IO).NavInputs[6];
    (pIVar23->IO).KeysData[0x271].Down = 0.0 < fVar60;
    (pIVar23->IO).KeysData[0x271].AnalogValue = fVar60;
    fVar60 = (pIVar23->IO).NavInputs[7];
    fVar76 = (pIVar23->IO).NavInputs[0xc];
    (pIVar23->IO).KeysData[0x272].Down = 0.0 < fVar60;
    (pIVar23->IO).KeysData[0x272].AnalogValue = fVar60;
    bVar57 = true;
    bVar56 = true;
    if (fVar76 <= 0.0) {
      bVar56 = 0.0 < (pIVar23->IO).NavInputs[0xe];
    }
    (pIVar23->IO).KeysData[0x273].Down = bVar56;
    fVar60 = (pIVar23->IO).NavInputs[0xd];
    fVar84 = (pIVar23->IO).NavInputs[0xe];
    uVar39 = -(uint)(fVar84 <= fVar76);
    (pIVar23->IO).KeysData[0x273].AnalogValue =
         (float)(~uVar39 & (uint)fVar84 | (uint)fVar76 & uVar39);
    if (fVar60 <= 0.0) {
      bVar57 = 0.0 < (pIVar23->IO).NavInputs[0xf];
    }
    (pIVar23->IO).KeysData[0x274].Down = bVar57;
    fVar76 = (pIVar23->IO).NavInputs[0xf];
    uVar39 = -(uint)(fVar76 <= fVar60);
    (pIVar23->IO).KeysData[0x274].AnalogValue =
         (float)(~uVar39 & (uint)fVar76 | (uint)fVar60 & uVar39);
    fVar60 = (pIVar23->IO).NavInputs[8];
    fVar76 = (pIVar23->IO).NavInputs[9];
    (pIVar23->IO).KeysData[0x279].Down = 0.0 < fVar60;
    (pIVar23->IO).KeysData[0x279].AnalogValue = fVar60;
    (pIVar23->IO).KeysData[0x27a].Down = 0.0 < fVar76;
    (pIVar23->IO).KeysData[0x27a].AnalogValue = fVar76;
    fVar60 = (pIVar23->IO).NavInputs[10];
    (pIVar23->IO).KeysData[0x27b].Down = 0.0 < fVar60;
    (pIVar23->IO).KeysData[0x27b].AnalogValue = fVar60;
    fVar60 = (pIVar23->IO).NavInputs[0xb];
    (pIVar23->IO).KeysData[0x27c].Down = 0.0 < fVar60;
    (pIVar23->IO).KeysData[0x27c].AnalogValue = fVar60;
  }
  local_70 = pIVar22;
  iVar41 = (uint)(GImGui->IO).KeyCtrl * 0x1000;
  iVar52 = iVar41 + 0x2000;
  if ((GImGui->IO).KeyShift == false) {
    iVar52 = iVar41;
  }
  iVar41 = iVar52 + 0x4000;
  if ((GImGui->IO).KeyAlt == false) {
    iVar41 = iVar52;
  }
  iVar52 = iVar41 + 0x8000;
  if ((GImGui->IO).KeySuper == false) {
    iVar52 = iVar41;
  }
  (pIVar23->IO).KeyMods = iVar52;
  lVar45 = -5;
  do {
    bVar56 = (pIVar23->IO).MouseDown[lVar45 + 5];
    fVar60 = 1.0;
    if (bVar56 == false) {
      fVar60 = 0.0;
    }
    pIVar33 = GetKeyData((int)lVar45 + ImGuiKey_MouseWheelX);
    pIVar33->Down = bVar56;
    pIVar33->AnalogValue = fVar60;
    pIVar22 = GImGui;
    lVar45 = lVar45 + 1;
  } while (lVar45 != 0);
  fVar60 = (pIVar23->IO).MouseWheelH;
  (GImGui->IO).KeysData[0x286].Down = fVar60 != 0.0;
  (pIVar22->IO).KeysData[0x286].AnalogValue = fVar60;
  fVar60 = (pIVar23->IO).MouseWheel;
  (pIVar22->IO).KeysData[0x287].Down = fVar60 != 0.0;
  (pIVar22->IO).KeysData[0x287].AnalogValue = fVar60;
  if (((pIVar23->IO).BackendFlags & 1) == 0) {
    lVar45 = 0;
    do {
      (&(pIVar23->IO).KeysData[0x269].Down)[lVar45] = false;
      *(undefined4 *)((long)&(pIVar23->IO).KeysData[0x269].AnalogValue + lVar45) = 0;
      lVar45 = lVar45 + 0x10;
    } while (lVar45 != 0x180);
  }
  lVar45 = 0xe24;
  do {
    fVar60 = *(float *)((long)pIVar23 + lVar45 + -4);
    *(float *)(&pIVar23->Initialized + lVar45) = fVar60;
    fVar76 = -1.0;
    if ((*(char *)((long)pIVar23 + lVar45 + -8) == '\x01') && (fVar76 = 0.0, 0.0 <= fVar60)) {
      fVar76 = fVar60 + (pIVar23->IO).DeltaTime;
    }
    *(float *)((long)pIVar23 + lVar45 + -4) = fVar76;
    lVar45 = lVar45 + 0x10;
  } while (lVar45 != 0x36e4);
  pbVar34 = &pIVar23->KeysOwnerData[0].LockUntilRelease;
  lVar45 = 0;
  do {
    ((ImGuiKeyOwnerData *)(pbVar34 + -9))->OwnerCurr = *(ImGuiID *)(pbVar34 + -5);
    if ((&(pIVar23->IO).KeysData[0x200].Down)[lVar45] == false) {
      *(ImGuiID *)(pbVar34 + -5) = 0xffffffff;
    }
    if (*pbVar34 == true) {
      bVar56 = (&(pIVar23->IO).KeysData[0x200].Down)[lVar45];
    }
    else {
      bVar56 = false;
    }
    *pbVar34 = bVar56;
    pbVar34[-1] = bVar56;
    pIVar22 = GImGui;
    lVar45 = lVar45 + 0x10;
    pbVar34 = pbVar34 + 0xc;
  } while (lVar45 != 0x8c0);
  iVar41 = (pIVar23->KeysRoutingTable).EntriesNext.Capacity;
  if (iVar41 < 0) {
    uVar39 = iVar41 / 2 + iVar41;
    uVar42 = 0;
    if (0 < (int)uVar39) {
      uVar42 = (ulong)uVar39;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar18 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar18 = *piVar18 + 1;
    }
    pIVar35 = (ImGuiKeyRoutingData *)(*GImAllocatorAllocFunc)(uVar42 << 4,GImAllocatorUserData);
    pIVar14 = (pIVar23->KeysRoutingTable).EntriesNext.Data;
    if (pIVar14 != (ImGuiKeyRoutingData *)0x0) {
      memcpy(pIVar35,pIVar14,(long)(pIVar23->KeysRoutingTable).EntriesNext.Size << 4);
      pIVar14 = (pIVar23->KeysRoutingTable).EntriesNext.Data;
      if ((pIVar14 != (ImGuiKeyRoutingData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar18 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar18 = *piVar18 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar14,GImAllocatorUserData);
    }
    (pIVar23->KeysRoutingTable).EntriesNext.Data = pIVar35;
    (pIVar23->KeysRoutingTable).EntriesNext.Capacity = (int)uVar42;
  }
  (pIVar23->KeysRoutingTable).EntriesNext.Size = 0;
  lVar45 = 0x200;
  do {
    iVar41 = (pIVar23->KeysRoutingTable).EntriesNext.Size;
    lVar55 = (long)iVar41;
    sVar8 = *(short *)(&pIVar23->KeysOwnerData[0x36].LockThisFrame + lVar45 * 2);
    while (sVar8 != -1) {
      pIVar35 = (pIVar23->KeysRoutingTable).Entries.Data;
      pIVar14 = pIVar35 + sVar8;
      IVar44 = pIVar35[sVar8].RoutingNext;
      pIVar35[sVar8].RoutingCurr = IVar44;
      pIVar35[sVar8].RoutingNext = 0xffffffff;
      pIVar35[sVar8].RoutingNextScore = 0xff;
      if (IVar44 != 0xffffffff) {
        iVar52 = (pIVar23->KeysRoutingTable).EntriesNext.Size;
        iVar48 = (pIVar23->KeysRoutingTable).EntriesNext.Capacity;
        if (iVar52 == iVar48) {
          if (iVar48 == 0) {
            iVar40 = 8;
          }
          else {
            iVar40 = iVar48 / 2 + iVar48;
          }
          iVar52 = iVar52 + 1;
          if (iVar52 < iVar40) {
            iVar52 = iVar40;
          }
          if (iVar48 < iVar52) {
            if (GImGui != (ImGuiContext *)0x0) {
              piVar18 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar18 = *piVar18 + 1;
            }
            __dest_01 = (ImGuiKeyRoutingData *)
                        (*GImAllocatorAllocFunc)((long)iVar52 << 4,GImAllocatorUserData);
            pIVar35 = (pIVar23->KeysRoutingTable).EntriesNext.Data;
            if (pIVar35 != (ImGuiKeyRoutingData *)0x0) {
              memcpy(__dest_01,pIVar35,(long)(pIVar23->KeysRoutingTable).EntriesNext.Size << 4);
              pIVar35 = (pIVar23->KeysRoutingTable).EntriesNext.Data;
              if ((pIVar35 != (ImGuiKeyRoutingData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                piVar18 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar18 = *piVar18 + -1;
              }
              (*GImAllocatorFreeFunc)(pIVar35,GImAllocatorUserData);
            }
            (pIVar23->KeysRoutingTable).EntriesNext.Data = __dest_01;
            (pIVar23->KeysRoutingTable).EntriesNext.Capacity = iVar52;
          }
        }
        IVar24 = pIVar14->Mods;
        IVar31 = pIVar14->RoutingNextScore;
        uVar25 = *(undefined3 *)&pIVar14->field_0x5;
        IVar44 = pIVar14->RoutingCurr;
        IVar26 = pIVar14->RoutingNext;
        pIVar35 = (pIVar23->KeysRoutingTable).EntriesNext.Data +
                  (pIVar23->KeysRoutingTable).EntriesNext.Size;
        pIVar35->NextEntryIndex = pIVar14->NextEntryIndex;
        pIVar35->Mods = IVar24;
        pIVar35->RoutingNextScore = IVar31;
        *(undefined3 *)&pIVar35->field_0x5 = uVar25;
        pIVar35->RoutingCurr = IVar44;
        pIVar35->RoutingNext = IVar26;
        pIVar2 = &(pIVar23->KeysRoutingTable).EntriesNext;
        pIVar2->Size = pIVar2->Size + 1;
        if (((pIVar22->IO).KeyMods == (uint)pIVar14->Mods) &&
           ((&(GImGui->IO).KeysData[0x191].DownDuration)[lVar45 * 3] == -NAN)) {
          (&(GImGui->IO).KeysData[0x191].DownDuration)[lVar45 * 3] = (float)pIVar14->RoutingCurr;
        }
      }
      sVar8 = pIVar14->NextEntryIndex;
    }
    iVar52 = 0xffff;
    if (iVar41 < (pIVar23->KeysRoutingTable).EntriesNext.Size) {
      iVar52 = iVar41;
    }
    *(short *)(&pIVar23->KeysOwnerData[0x36].LockThisFrame + lVar45 * 2) = (short)iVar52;
    uVar39 = (pIVar23->KeysRoutingTable).EntriesNext.Size;
    uVar42 = (ulong)uVar39;
    if (iVar41 < (int)uVar39) {
      lVar53 = lVar55 << 4;
      do {
        iVar41 = iVar41 + 1;
        lVar55 = lVar55 + 1;
        uVar43 = (undefined2)iVar41;
        if ((int)uVar42 <= lVar55) {
          uVar43 = 0xffff;
        }
        *(undefined2 *)
         ((long)&((pIVar23->KeysRoutingTable).EntriesNext.Data)->NextEntryIndex + lVar53) = uVar43;
        uVar42 = (ulong)(pIVar23->KeysRoutingTable).EntriesNext.Size;
        lVar53 = lVar53 + 0x10;
      } while (lVar55 < (long)uVar42);
    }
    lVar45 = lVar45 + 1;
  } while (lVar45 != 0x28c);
  iVar41 = (pIVar23->KeysRoutingTable).Entries.Capacity;
  pIVar14 = (pIVar23->KeysRoutingTable).Entries.Data;
  iVar52 = (pIVar23->KeysRoutingTable).EntriesNext.Size;
  iVar48 = (pIVar23->KeysRoutingTable).EntriesNext.Capacity;
  pIVar35 = (pIVar23->KeysRoutingTable).EntriesNext.Data;
  (pIVar23->KeysRoutingTable).EntriesNext.Size = (pIVar23->KeysRoutingTable).Entries.Size;
  (pIVar23->KeysRoutingTable).EntriesNext.Capacity = iVar41;
  (pIVar23->KeysRoutingTable).EntriesNext.Data = pIVar14;
  (pIVar23->KeysRoutingTable).Entries.Size = iVar52;
  (pIVar23->KeysRoutingTable).Entries.Capacity = iVar48;
  (pIVar23->KeysRoutingTable).Entries.Data = pIVar35;
  pIVar22 = GImGui;
  (GImGui->IO).WantSetMousePos = false;
  uVar39 = (pIVar22->IO).ConfigFlags;
  if ((uVar39 & 2) == 0) {
    bVar27 = 0;
  }
  else {
    bVar27 = (byte)(pIVar22->IO).BackendFlags & 1;
  }
  this = (ImGui *)0x28c;
  if (bVar27 != 0) {
    lVar45 = 0;
    do {
      this = (ImGui *)(ulong)*(ImGuiKey *)((long)&DAT_0025ef70 + lVar45);
      bVar56 = IsKeyDown(*(ImGuiKey *)((long)&DAT_0025ef70 + lVar45));
      if (bVar56) {
        pIVar22->NavInputSource = ImGuiInputSource_Gamepad;
      }
      lVar45 = lVar45 + 4;
    } while (lVar45 != 0x20);
  }
  if ((uVar39 & 1) != 0) {
    lVar45 = 0;
    do {
      this = (ImGui *)(ulong)*(ImGuiKey *)((long)&DAT_0025c610 + lVar45);
      bVar56 = IsKeyDown(*(ImGuiKey *)((long)&DAT_0025c610 + lVar45));
      if (bVar56) {
        pIVar22->NavInputSource = ImGuiInputSource_Keyboard;
      }
      lVar45 = lVar45 + 4;
    } while (lVar45 != 0x1c);
  }
  if (pIVar22->NavInitResultId != 0) {
    NavInitRequestApplyResult();
  }
  pIVar22->NavInitRequest = false;
  pIVar22->NavInitRequestFromMove = false;
  pIVar22->NavInitResultId = 0;
  pIVar22->NavJustMovedToId = 0;
  if (pIVar22->NavMoveSubmitted == true) {
    NavMoveRequestApplyResult(this);
  }
  pIVar22->NavTabbingCounter = 0;
  pIVar22->NavMoveSubmitted = false;
  pIVar22->NavMoveScoringItems = false;
  if ((((pIVar22->NavMousePosDirty == true) && (pIVar22->NavIdIsAlive == true)) &&
      (pIVar22->NavDisableHighlight == false)) && (pIVar22->NavDisableMouseHover == true)) {
    bVar56 = pIVar22->NavWindow != (ImGuiWindow *)0x0;
  }
  else {
    bVar56 = false;
  }
  pIVar22->NavMousePosDirty = false;
  pIVar36 = pIVar22->NavWindow;
  for (pIVar37 = pIVar36; pIVar37 != (ImGuiWindow *)0x0; pIVar37 = pIVar37->ParentWindow) {
    if ((pIVar37->RootWindow == pIVar37) || ((pIVar37->Flags & 0x14000000) != 0)) {
      if (pIVar37 != pIVar36) {
        pIVar37->NavLastChildNavWindow = pIVar36;
      }
      break;
    }
  }
  pIVar36 = pIVar22->NavWindow;
  if (((pIVar36 != (ImGuiWindow *)0x0) && (pIVar36->NavLastChildNavWindow != (ImGuiWindow *)0x0)) &&
     (pIVar22->NavLayer == ImGuiNavLayer_Main)) {
    pIVar36->NavLastChildNavWindow = (ImGuiWindow *)0x0;
  }
  pIVar23 = GImGui;
  pIVar36 = GetTopMostPopupModal();
  if (pIVar36 != (ImGuiWindow *)0x0) {
    pIVar23->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar23->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar23->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar60 = (pIVar23->IO).DeltaTime * -10.0 + pIVar23->NavWindowingHighlightAlpha;
    fVar60 = (float)(-(uint)(0.0 <= fVar60) & (uint)fVar60);
    pIVar23->NavWindowingHighlightAlpha = fVar60;
    if ((pIVar23->DimBgRatio <= 0.0) && (fVar60 <= 0.0)) {
      pIVar23->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  fVar60 = (float)(pIVar23->IO).ConfigFlags;
  bVar57 = true;
  if (((uint)fVar60 & 2) != 0) {
    bVar57 = ((pIVar23->IO).BackendFlags & 1) == 0;
  }
  if ((pIVar36 == (ImGuiWindow *)0x0) && (pIVar23->ConfigNavWindowingKeyNext != 0)) {
    bVar29 = Shortcut(pIVar23->ConfigNavWindowingKeyNext,0xffffffff,0x1001);
  }
  else {
    bVar29 = false;
  }
  if (pIVar36 == (ImGuiWindow *)0x0) {
    if (pIVar23->ConfigNavWindowingKeyPrev == 0) goto LAB_001e8013;
    bVar30 = Shortcut(pIVar23->ConfigNavWindowingKeyPrev,0xffffffff,0x1001);
  }
  else {
    bVar57 = true;
LAB_001e8013:
    bVar30 = false;
  }
  local_68 = fVar60;
  if ((bVar57) || (pIVar23->NavWindowingTarget != (ImGuiWindow *)0x0)) {
    bVar57 = false;
  }
  else {
    bVar57 = IsKeyPressed(ImGuiKey_GamepadFaceLeft,0,0);
  }
  if (pIVar36 == (ImGuiWindow *)0x0) {
    bVar54 = (bVar29 | bVar30) & pIVar23->NavWindowingTarget == (ImGuiWindow *)0x0;
  }
  else {
    bVar54 = 0;
  }
  if ((bVar57 != false) || (bVar54 != 0)) {
    pIVar36 = pIVar23->NavWindow;
    if (pIVar36 == (ImGuiWindow *)0x0) {
      pIVar36 = FindWindowNavFocusable((pIVar23->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
    }
    if (pIVar36 != (ImGuiWindow *)0x0) {
      pIVar36 = pIVar36->RootWindow;
      pIVar23->NavWindowingTargetAnim = pIVar36;
      pIVar23->NavWindowingTarget = pIVar36;
      pIVar23->NavWindowingTimer = 0.0;
      pIVar23->NavWindowingHighlightAlpha = 0.0;
      (pIVar23->NavWindowingAccumDeltaPos).x = 0.0;
      (pIVar23->NavWindowingAccumDeltaPos).y = 0.0;
      (pIVar23->NavWindowingAccumDeltaSize).x = 0.0;
      (pIVar23->NavWindowingAccumDeltaSize).y = 0.0;
      pIVar23->NavWindowingToggleLayer = bVar57;
      pIVar23->NavInputSource = bVar54 ^ ImGuiInputSource_Gamepad;
    }
  }
  fVar60 = (pIVar23->IO).DeltaTime + pIVar23->NavWindowingTimer;
  pIVar23->NavWindowingTimer = fVar60;
  if ((pIVar23->NavWindowingTarget == (ImGuiWindow *)0x0) ||
     (pIVar23->NavInputSource != ImGuiInputSource_Gamepad)) {
    bVar57 = false;
    pIVar36 = (ImGuiWindow *)0x0;
  }
  else {
    fVar76 = (fVar60 + -0.2) / 0.05;
    fVar60 = 1.0;
    if (fVar76 <= 1.0) {
      fVar60 = fVar76;
    }
    fVar60 = (float)(~-(uint)(fVar76 < 0.0) & (uint)fVar60);
    uVar58 = -(uint)(fVar60 <= pIVar23->NavWindowingHighlightAlpha);
    pIVar23->NavWindowingHighlightAlpha =
         (float)(uVar58 & (uint)pIVar23->NavWindowingHighlightAlpha | ~uVar58 & (uint)fVar60);
    bVar57 = IsKeyPressed(ImGuiKey_GamepadL1,0,1);
    bVar28 = IsKeyPressed(ImGuiKey_GamepadR1,0,1);
    if ((uint)bVar57 - (uint)bVar28 != 0) {
      NavUpdateWindowingHighlightWindow((uint)bVar57 - (uint)bVar28);
      pIVar23->NavWindowingHighlightAlpha = 1.0;
    }
    bVar57 = IsKeyDown(ImGuiKey_GamepadFaceLeft);
    if (bVar57) {
      bVar57 = false;
      pIVar36 = (ImGuiWindow *)0x0;
    }
    else {
      pbVar34 = &pIVar23->NavWindowingToggleLayer;
      *pbVar34 = (bool)(*pbVar34 &
                       (pIVar23->NavWindowingHighlightAlpha <= 1.0 &&
                       pIVar23->NavWindowingHighlightAlpha != 1.0));
      if (*pbVar34 == false) {
        pIVar36 = pIVar23->NavWindowingTarget;
        bVar57 = false;
      }
      else {
        bVar57 = pIVar23->NavWindow != (ImGuiWindow *)0x0;
        pIVar36 = (ImGuiWindow *)0x0;
      }
      pIVar23->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
  }
  pIVar37 = pIVar23->NavWindowingTarget;
  if ((pIVar37 != (ImGuiWindow *)0x0) && (pIVar23->NavInputSource == ImGuiInputSource_Keyboard)) {
    uVar58 = pIVar23->ConfigNavWindowingKeyPrev;
    fVar76 = (pIVar23->NavWindowingTimer + -0.2) / 0.05;
    fVar60 = 1.0;
    if (fVar76 <= 1.0) {
      fVar60 = fVar76;
    }
    fVar60 = (float)(~-(uint)(fVar76 < 0.0) & (uint)fVar60);
    uVar59 = -(uint)(fVar60 <= pIVar23->NavWindowingHighlightAlpha);
    pIVar23->NavWindowingHighlightAlpha =
         (float)(uVar59 & (uint)pIVar23->NavWindowingHighlightAlpha | ~uVar59 & (uint)fVar60);
    if ((bVar30 | bVar29) == 1) {
      NavUpdateWindowingHighlightWindow(-(uint)bVar29 | 1);
      pIVar37 = extraout_RAX;
    }
    else {
      uVar59 = pIVar23->ConfigNavWindowingKeyNext & 0xf000;
      if (uVar58 == 0) {
        uVar58 = 0xf000;
      }
      if (pIVar23->ConfigNavWindowingKeyNext == 0) {
        uVar59 = 0xf000;
      }
      if ((uVar59 & uVar58 & ~(pIVar23->IO).KeyMods) != 0) {
        pIVar36 = pIVar37;
      }
    }
  }
  uVar32 = SUB84(pIVar37,0);
  if (((uint)local_68 & 1) != 0) {
    bVar29 = IsKeyPressed(ImGuiKey_ModAlt,0xffffffff,0);
    uVar32 = (undefined4)CONCAT71(extraout_var,bVar29);
    if (bVar29) {
      pIVar23->NavWindowingToggleLayer = true;
      pIVar23->NavInputSource = ImGuiInputSource_Keyboard;
    }
  }
  if ((pIVar23->NavWindowingToggleLayer == true) &&
     (pIVar23->NavInputSource == ImGuiInputSource_Keyboard)) {
    if (((0 < (pIVar23->IO).InputQueueCharacters.Size) ||
        ((((pIVar23->IO).KeyCtrl != false || ((pIVar23->IO).KeyShift != false)) ||
         ((pIVar23->IO).KeySuper != false)))) ||
       (GImGui->KeysOwnerData[0x8a].OwnerCurr != 0xffffffff)) {
      pIVar23->NavWindowingToggleLayer = false;
    }
    bVar30 = IsKeyReleased(ImGuiKey_ModAlt,0);
    bVar29 = bVar57;
    if ((((bVar30) && (pIVar23->NavWindowingToggleLayer == true)) &&
        ((pIVar23->ActiveId == 0 || (pIVar23->ActiveIdAllowOverlap == true)))) &&
       (bVar29 = true,
       (-256000.0 <= (pIVar23->IO).MousePos.x && -256000.0 <= (pIVar23->IO).MousePos.y) !=
       (-256000.0 <= (pIVar23->IO).MousePosPrev.y && -256000.0 <= (pIVar23->IO).MousePosPrev.x))) {
      bVar29 = bVar57;
    }
    bVar57 = bVar29;
    bVar29 = IsKeyDown(ImGuiKey_ModAlt);
    uVar32 = (undefined4)CONCAT71(extraout_var_00,bVar29);
    if (!bVar29) {
      pIVar23->NavWindowingToggleLayer = false;
    }
  }
  pIVar37 = pIVar23->NavWindowingTarget;
  if ((pIVar37 != (ImGuiWindow *)0x0) && ((pIVar37->Flags & 4) == 0)) {
    IVar9 = pIVar23->NavInputSource;
    auVar82 = ZEXT816(0);
    if ((IVar9 == ImGuiInputSource_Keyboard) && ((pIVar23->IO).KeyShift == false)) {
      auVar82._0_8_ =
           GetKeyVector2d(ImGuiKey_LeftArrow,ImGuiKey_RightArrow,ImGuiKey_UpArrow,ImGuiKey_DownArrow
                         );
      auVar82._8_8_ = extraout_XMM0_Qb;
      uVar32 = extraout_EAX;
    }
    if (IVar9 == ImGuiInputSource_Gamepad) {
      auVar82._0_8_ =
           GetKeyVector2d(ImGuiKey_GamepadLStickLeft,ImGuiKey_GamepadLStickRight,
                          ImGuiKey_GamepadLStickUp,ImGuiKey_GamepadLStickDown);
      auVar82._8_8_ = extraout_XMM0_Qb_00;
      uVar32 = extraout_EAX_00;
    }
    fVar60 = auVar82._4_4_;
    if (((auVar82._0_4_ != 0.0) || (fVar60 != 0.0)) || (NAN(fVar60))) {
      fVar76 = (pIVar23->IO).DisplayFramebufferScale.x;
      fVar84 = (pIVar23->IO).DisplayFramebufferScale.y;
      if (fVar84 <= fVar76) {
        fVar76 = fVar84;
      }
      fVar76 = fVar76 * (pIVar23->IO).DeltaTime * 800.0;
      pIVar23->NavDisableMouseHover = true;
      IVar64.x = (pIVar23->NavWindowingAccumDeltaPos).x + auVar82._0_4_ * fVar76;
      IVar64.y = (pIVar23->NavWindowingAccumDeltaPos).y + fVar60 * fVar76;
      pIVar23->NavWindowingAccumDeltaPos = IVar64;
      iVar52 = (int)IVar64.x;
      iVar48 = (int)IVar64.y;
      auVar74._0_4_ = -(uint)(iVar52 == 0);
      auVar74._4_4_ = -(uint)(iVar52 == 0);
      auVar74._8_4_ = -(uint)(iVar48 == 0);
      auVar74._12_4_ = -(uint)(iVar48 == 0);
      iVar41 = movmskpd(uVar32,auVar74);
      if (iVar41 != 3) {
        local_68 = (float)iVar52;
        fStack_64 = (float)iVar48;
        fStack_60 = (float)(int)(auVar82._8_4_ * fVar76 + 0.0);
        fStack_5c = (float)(int)(auVar82._12_4_ * fVar76 + 0.0);
        IVar64 = pIVar37->RootWindow->Pos;
        local_88.Min.x = IVar64.x + local_68;
        local_88.Min.y = IVar64.y + fStack_64;
        SetWindowPos(pIVar37->RootWindow,&local_88.Min,1);
        IVar62.x = (pIVar23->NavWindowingAccumDeltaPos).x - local_68;
        IVar62.y = (pIVar23->NavWindowingAccumDeltaPos).y - fStack_64;
        pIVar23->NavWindowingAccumDeltaPos = IVar62;
      }
    }
  }
  if (pIVar36 != (ImGuiWindow *)0x0) {
    if ((pIVar23->NavWindow == (ImGuiWindow *)0x0) || (pIVar36 != pIVar23->NavWindow->RootWindow)) {
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar47 = GImGui;
      pIVar47->NavMousePosDirty = true;
      pIVar47->NavDisableHighlight = false;
      pIVar47->NavDisableMouseHover = true;
      pIVar37 = pIVar36->NavLastChildNavWindow;
      if ((pIVar37 == (ImGuiWindow *)0x0) || (pIVar37->WasActive == false)) {
        pIVar37 = pIVar36;
      }
      ClosePopupsOverWindow(pIVar37,false);
      FocusWindow(pIVar37);
      if (pIVar37->NavLastIds[0] == 0) {
        NavInitWindow(pIVar37,false);
      }
      if ((pIVar37->DC).NavLayersActiveMaskNext == 2) {
        pIVar23->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar23->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar57) && (pIVar23->NavWindow != (ImGuiWindow *)0x0)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
    pIVar36 = pIVar23->NavWindow;
    pIVar37 = pIVar36;
    do {
      window = pIVar37;
      if ((window->ParentWindow == (ImGuiWindow *)0x0) ||
         (((window->DC).NavLayersActiveMask & 2) != 0)) break;
      pIVar37 = window->ParentWindow;
    } while ((window->Flags & 0x15000000U) == 0x1000000);
    if (window != pIVar36) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar36;
    }
    IVar50 = ImGuiNavLayer_Main;
    if (((pIVar23->NavWindow->DC).NavLayersActiveMask & 2) != 0) {
      IVar50 = pIVar23->NavLayer ^ ImGuiNavLayer_Menu;
    }
    if (IVar50 != pIVar23->NavLayer) {
      if (IVar50 == ImGuiNavLayer_Menu) {
        pIVar23->NavWindow->NavLastIds[1] = 0;
      }
      NavRestoreLayer(IVar50);
      pIVar23 = GImGui;
      pIVar23->NavMousePosDirty = true;
      pIVar23->NavDisableHighlight = false;
      pIVar23->NavDisableMouseHover = true;
    }
  }
  local_68 = (float)CONCAT31(local_68._1_3_,(byte)uVar39 | bVar27);
  if (((uVar39 & 1) == 0 && bVar27 == 0) || (pIVar22->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar22->IO).NavActive = false;
LAB_001e86aa:
    bVar57 = pIVar22->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar57 = (pIVar22->NavWindow->Flags & 0x40000U) == 0;
    (pIVar22->IO).NavActive = bVar57;
    if (((!bVar57) || (pIVar22->NavId == 0)) ||
       (bVar57 = true, pIVar22->NavDisableHighlight != false)) goto LAB_001e86aa;
  }
  (pIVar22->IO).NavVisible = bVar57;
  pIVar23 = GImGui;
  uVar58 = (GImGui->IO).ConfigFlags;
  if ((uVar58 & 2) == 0) {
    bVar54 = 0;
  }
  else {
    bVar54 = (byte)(GImGui->IO).BackendFlags & 1;
  }
  if ((((uVar58 & 1) != 0) && (bVar57 = IsKeyPressed(ImGuiKey_Escape,0xffffffff,0), bVar57)) ||
     ((bVar54 != 0 && (bVar57 = IsKeyPressed(ImGuiKey_GamepadFaceRight,0xffffffff,0), bVar57)))) {
    if ((pIVar23->DebugLogFlags & 8) != 0) {
      DebugLog("[nav] NavUpdateCancelRequest()\n");
    }
    if (pIVar23->ActiveId == 0) {
      if (pIVar23->NavLayer == ImGuiNavLayer_Main) {
        pIVar36 = pIVar23->NavWindow;
        if (((pIVar36 == (ImGuiWindow *)0x0) || (pIVar36 == pIVar36->RootWindow)) ||
           (((pIVar36->Flags & 0x4000000) != 0 ||
            (pIVar37 = pIVar36->ParentWindow, pIVar37 == (ImGuiWindow *)0x0)))) {
          iVar41 = (pIVar23->OpenPopupStack).Size;
          if ((((long)iVar41 < 1) ||
              (pIVar37 = (pIVar23->OpenPopupStack).Data[(long)iVar41 + -1].Window,
              pIVar37 == (ImGuiWindow *)0x0)) || ((pIVar37->Flags & 0x8000000) != 0)) {
            if ((pIVar36 != (ImGuiWindow *)0x0) && ((pIVar36->Flags & 0x5000000U) != 0x1000000)) {
              pIVar36->NavLastIds[0] = 0;
            }
            pIVar23->NavId = 0;
          }
          else {
            ClosePopupToLevel(iVar41 + -1,true);
          }
        }
        else {
          local_58 = pIVar36->Pos;
          uStack_50 = 0;
          local_48 = CONCAT44((pIVar36->Size).y + local_58.y,(pIVar36->Size).x + local_58.x);
          uStack_40 = 0;
          FocusWindow(pIVar37);
          pIVar23 = GImGui;
          IVar44 = pIVar36->ChildId;
          IVar64 = (pIVar37->DC).CursorStartPos;
          fVar60 = IVar64.x;
          IVar69.x = local_58.x - fVar60;
          fVar76 = IVar64.y;
          IVar69.y = local_58.y - fVar76;
          IVar72.x = (float)local_48 - fVar60;
          IVar72.y = local_48._4_4_ - fVar76;
          GImGui->NavId = IVar44;
          pIVar23->NavLayer = ImGuiNavLayer_Main;
          pIVar23->NavFocusScopeId = 0;
          pIVar23->NavWindow->NavLastIds[0] = IVar44;
          pIVar36 = pIVar23->NavWindow;
          pIVar36->NavRectRel[0].Min = IVar69;
          pIVar36->NavRectRel[0].Max = IVar72;
          pIVar23->NavMousePosDirty = true;
          pIVar23->NavDisableHighlight = false;
          pIVar23->NavDisableMouseHover = true;
        }
      }
      else {
        NavRestoreLayer(ImGuiNavLayer_Main);
        pIVar23 = GImGui;
        pIVar23->NavMousePosDirty = true;
        pIVar23->NavDisableHighlight = false;
        pIVar23->NavDisableMouseHover = true;
      }
    }
    else {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
  }
  pIVar22->NavActivateId = 0;
  pIVar22->NavActivateDownId = 0;
  pIVar22->NavActivatePressedId = 0;
  pIVar22->NavActivateInputId = 0;
  pIVar22->NavActivateFlags = 0;
  IVar44 = pIVar22->NavId;
  if (((IVar44 != 0) && (pIVar22->NavDisableHighlight == false)) &&
     ((pIVar22->NavWindowingTarget == (ImGuiWindow *)0x0 &&
      ((pIVar22->NavWindow != (ImGuiWindow *)0x0 && ((pIVar22->NavWindow->Flags & 0x40000) == 0)))))
     ) {
    if ((uVar39 & 1) == 0) {
      if (bVar27 != 0) goto LAB_001e8dc0;
      bVar57 = false;
    }
    else {
      bVar57 = IsKeyDown(ImGuiKey_Space);
      if ((!bVar57) && (bVar27 == 1)) {
LAB_001e8dc0:
        bVar57 = IsKeyDown(ImGuiKey_GamepadFaceDown);
      }
    }
    if (bVar57 == false) {
LAB_001e8e5f:
      bVar29 = false;
    }
    else {
      if ((uVar39 & 1) == 0) {
        if (bVar27 == 0) goto LAB_001e8e5f;
      }
      else {
        bVar29 = IsKeyPressed(ImGuiKey_Space,0,0);
        if ((bVar29) || (bVar27 != 1)) goto LAB_001e8e62;
      }
      bVar29 = IsKeyPressed(ImGuiKey_GamepadFaceDown,0,0);
    }
LAB_001e8e62:
    if ((uVar39 & 1) == 0) {
      if (bVar27 != 0) goto LAB_001e8e84;
LAB_001e8eca:
      bVar30 = false;
    }
    else {
      bVar30 = IsKeyDown(ImGuiKey_Enter);
      if ((!bVar30) && (bVar27 == 1)) {
LAB_001e8e84:
        bVar30 = IsKeyDown(ImGuiKey_GamepadFaceUp);
      }
      if (bVar30 == false) goto LAB_001e8eca;
      if ((uVar39 & 1) == 0) {
        if (bVar27 == 0) goto LAB_001e8eca;
LAB_001e8eba:
        bVar30 = IsKeyPressed(ImGuiKey_GamepadFaceUp,0,0);
      }
      else {
        bVar30 = IsKeyPressed(ImGuiKey_Enter,0,0);
        if ((!bVar30) && (bVar27 == 1)) goto LAB_001e8eba;
      }
    }
    if (bVar29 == true && pIVar22->ActiveId == 0) {
      pIVar22->NavActivateId = IVar44;
      pIVar22->NavActivateFlags = 2;
    }
    if (pIVar22->ActiveId != 0) {
      bVar30 = (bool)(bVar30 & pIVar22->ActiveId == pIVar22->NavId);
    }
    if (bVar30 != false) {
      pIVar22->NavActivateInputId = pIVar22->NavId;
      pIVar22->NavActivateFlags = 1;
    }
    if (pIVar22->ActiveId != 0) {
      bVar57 = (bool)(bVar57 & pIVar22->ActiveId == pIVar22->NavId);
    }
    if (bVar57 != false) {
      pIVar22->NavActivateDownId = pIVar22->NavId;
    }
    if (pIVar22->ActiveId != 0) {
      bVar29 = (bool)(bVar29 & pIVar22->ActiveId == pIVar22->NavId);
    }
    if (bVar29 != false) {
      pIVar22->NavActivatePressedId = pIVar22->NavId;
    }
  }
  if ((pIVar22->NavWindow != (ImGuiWindow *)0x0) && ((pIVar22->NavWindow->Flags & 0x40000) != 0)) {
    pIVar22->NavDisableHighlight = true;
  }
  IVar44 = pIVar22->NavNextActivateId;
  if (IVar44 != 0) {
    if ((pIVar22->NavNextActivateFlags & 1) == 0) {
      pIVar22->NavActivatePressedId = IVar44;
      pIVar22->NavActivateDownId = IVar44;
      pIVar22->NavActivateId = IVar44;
    }
    else {
      pIVar22->NavActivateInputId = IVar44;
    }
    pIVar22->NavActivateFlags = pIVar22->NavNextActivateFlags;
  }
  pIVar22->NavNextActivateId = 0;
  pIVar23 = GImGui;
  pIVar36 = GImGui->NavWindow;
  uVar39 = (GImGui->IO).ConfigFlags;
  if ((uVar39 & 2) == 0) {
    bVar54 = 0;
  }
  else {
    bVar54 = (byte)(GImGui->IO).BackendFlags & 1;
  }
  if ((pIVar36 != (ImGuiWindow *)0x0 & GImGui->NavMoveForwardToNextFrame) == 1) {
    if ((GImGui->DebugLogFlags & 8) != 0) {
      DebugLog("[nav] NavMoveRequestForward %d\n",(ulong)(uint)GImGui->NavMoveDir);
    }
  }
  else {
    GImGui->NavMoveDir = -1;
    pIVar23->NavMoveFlags = 0;
    pIVar23->NavMoveScrollFlags = 0;
    if (((pIVar36 != (ImGuiWindow *)0x0) && (pIVar23->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar36->Flags & 0x40000) == 0)) {
      if (((pIVar23->ActiveIdUsingNavDirMask & 1) == 0) &&
         (((bVar54 != 0 && (bVar57 = IsKeyPressed(ImGuiKey_GamepadDpadLeft,0xffffffff,5), bVar57))
          || (((uVar39 & 1) != 0 && (bVar57 = IsKeyPressed(ImGuiKey_LeftArrow,0xffffffff,5), bVar57)
              ))))) {
        pIVar23->NavMoveDir = 0;
      }
      if (((pIVar23->ActiveIdUsingNavDirMask & 2) == 0) &&
         (((bVar54 != 0 && (bVar57 = IsKeyPressed(ImGuiKey_GamepadDpadRight,0xffffffff,5), bVar57))
          || (((uVar39 & 1) != 0 &&
              (bVar57 = IsKeyPressed(ImGuiKey_RightArrow,0xffffffff,5), bVar57)))))) {
        pIVar23->NavMoveDir = 1;
      }
      if (((pIVar23->ActiveIdUsingNavDirMask & 4) == 0) &&
         (((bVar54 != 0 && (bVar57 = IsKeyPressed(ImGuiKey_GamepadDpadUp,0xffffffff,5), bVar57)) ||
          (((uVar39 & 1) != 0 && (bVar57 = IsKeyPressed(ImGuiKey_UpArrow,0xffffffff,5), bVar57))))))
      {
        pIVar23->NavMoveDir = 2;
      }
      if (((pIVar23->ActiveIdUsingNavDirMask & 8) == 0) &&
         (((bVar54 != 0 && (bVar57 = IsKeyPressed(ImGuiKey_GamepadDpadDown,0xffffffff,5), bVar57))
          || (((uVar39 & 1) != 0 && (bVar57 = IsKeyPressed(ImGuiKey_DownArrow,0xffffffff,5), bVar57)
              ))))) {
        pIVar23->NavMoveDir = 3;
      }
    }
    pIVar23->NavMoveClipDir = pIVar23->NavMoveDir;
    (pIVar23->NavScoringNoClipRect).Min.x = 3.4028235e+38;
    (pIVar23->NavScoringNoClipRect).Min.y = 3.4028235e+38;
    (pIVar23->NavScoringNoClipRect).Max.x = -3.4028235e+38;
    (pIVar23->NavScoringNoClipRect).Max.y = -3.4028235e+38;
  }
  pIVar47 = GImGui;
  fVar60 = 0.0;
  if ((((pIVar36 != (ImGuiWindow *)0x0) && ((uVar39 & 1) != 0)) && (pIVar23->NavMoveDir == -1)) &&
     ((pIVar37 = GImGui->NavWindow, (pIVar37->Flags & 0x40000) == 0 &&
      (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) {
    if (((GImGui->IO).KeysData[0x205].Down == true) &&
       ((GImGui->ActiveIdUsingAllKeyboardKeys != true || (GImGui->ActiveId == 0xffffffff)))) {
      bVar57 = GImGui->KeysOwnerData[5].OwnerCurr == 0xffffffff;
    }
    else {
      bVar57 = false;
    }
    if (((GImGui->IO).KeysData[0x206].Down == true) &&
       ((GImGui->ActiveIdUsingAllKeyboardKeys != true || (GImGui->ActiveId == 0xffffffff)))) {
      bVar29 = GImGui->KeysOwnerData[6].OwnerCurr == 0xffffffff;
    }
    else {
      bVar29 = false;
    }
    bVar30 = IsKeyPressed(ImGuiKey_Home,0xffffffff,1);
    bVar28 = IsKeyPressed(ImGuiKey_End,0xffffffff,1);
    local_48 = CONCAT71(local_48._1_7_,bVar30);
    local_58.x._0_1_ = bVar28;
    fVar60 = 0.0;
    if ((bool)(bVar30 != bVar28 | bVar57 ^ bVar29)) {
      if (pIVar47->NavLayer != ImGuiNavLayer_Main) {
        NavRestoreLayer(ImGuiNavLayer_Main);
      }
      if (((pIVar37->DC).NavLayersActiveMask == 0) && ((pIVar37->DC).NavHasScroll == true)) {
        bVar57 = IsKeyPressed(ImGuiKey_PageUp,0xffffffff,1);
        if (bVar57) {
          fVar60 = (pIVar37->Scroll).y - ((pIVar37->InnerRect).Max.y - (pIVar37->InnerRect).Min.y);
        }
        else {
          bVar57 = IsKeyPressed(ImGuiKey_PageDown,0xffffffff,1);
          if (!bVar57) {
            if ((char)local_48 == '\0') {
              fVar60 = 0.0;
              if (local_58.x._0_1_ != '\0') {
                (pIVar37->ScrollTarget).y = (pIVar37->ScrollMax).y;
                (pIVar37->ScrollTargetCenterRatio).y = 0.0;
                (pIVar37->ScrollTargetEdgeSnapDist).y = 0.0;
              }
            }
            else {
              (pIVar37->ScrollTarget).y = 0.0;
              (pIVar37->ScrollTargetCenterRatio).y = 0.0;
              (pIVar37->ScrollTargetEdgeSnapDist).y = 0.0;
LAB_001e8fcd:
              fVar60 = 0.0;
            }
            goto LAB_001e9072;
          }
          fVar60 = ((pIVar37->InnerRect).Max.y - (pIVar37->InnerRect).Min.y) + (pIVar37->Scroll).y;
        }
        (pIVar37->ScrollTarget).y = fVar60;
        (pIVar37->ScrollTargetCenterRatio).y = 0.0;
        (pIVar37->ScrollTargetEdgeSnapDist).y = 0.0;
        fVar60 = 0.0;
      }
      else {
        IVar50 = pIVar47->NavLayer;
        pIVar46 = pIVar37->NavRectRel + IVar50;
        fVar60 = GImGui->FontBaseSize * pIVar37->FontWindowScale;
        if (pIVar37->ParentWindow != (ImGuiWindow *)0x0) {
          fVar60 = fVar60 * pIVar37->ParentWindow->FontWindowScale;
        }
        fVar60 = (pIVar37->NavRectRel[IVar50].Max.y - pIVar37->NavRectRel[IVar50].Min.y) +
                 (((pIVar37->InnerRect).Max.y - (pIVar37->InnerRect).Min.y) - fVar60);
        fVar60 = (float)(~-(uint)(fVar60 <= 0.0) & (uint)fVar60);
        bVar57 = IsKeyPressed(ImGuiKey_PageUp,0,1);
        if (bVar57) {
          fVar60 = -fVar60;
          pIVar47->NavMoveDir = 3;
          pIVar47->NavMoveClipDir = 2;
          pIVar47->NavMoveFlags = 0x30;
        }
        else {
          bVar57 = IsKeyPressed(ImGuiKey_PageDown,0,1);
          if (bVar57) {
            pIVar47->NavMoveDir = 2;
            pIVar47->NavMoveClipDir = 3;
            pIVar47->NavMoveFlags = 0x30;
          }
          else {
            if ((char)local_48 != '\0') {
              pIVar37->NavRectRel[IVar50].Max.y = 0.0;
              pIVar37->NavRectRel[IVar50].Min.y = 0.0;
              fVar60 = (pIVar46->Min).x;
              pIVar1 = &pIVar37->NavRectRel[IVar50].Max;
              if (pIVar1->x <= fVar60 && fVar60 != pIVar1->x) {
                pIVar37->NavRectRel[IVar50].Max.x = 0.0;
                (pIVar46->Min).x = 0.0;
              }
              pIVar47->NavMoveDir = 3;
              pIVar47->NavMoveFlags = 0x50;
              goto LAB_001e8fcd;
            }
            fVar60 = 0.0;
            if (local_58.x._0_1_ != '\0') {
              fVar76 = (pIVar37->ContentSize).y;
              pIVar37->NavRectRel[IVar50].Max.y = fVar76;
              pIVar37->NavRectRel[IVar50].Min.y = fVar76;
              fVar76 = (pIVar46->Min).x;
              pIVar1 = &pIVar37->NavRectRel[IVar50].Max;
              if (pIVar1->x <= fVar76 && fVar76 != pIVar1->x) {
                pIVar37->NavRectRel[IVar50].Max.x = 0.0;
                (pIVar46->Min).x = 0.0;
              }
              pIVar47->NavMoveDir = 2;
              pIVar47->NavMoveFlags = 0x50;
            }
          }
        }
      }
    }
  }
LAB_001e9072:
  if ((fVar60 != 0.0) || (NAN(fVar60))) {
    IVar64 = (pIVar36->InnerRect).Max;
    (pIVar23->NavScoringNoClipRect).Min = (pIVar36->InnerRect).Min;
    (pIVar23->NavScoringNoClipRect).Max = IVar64;
    (pIVar23->NavScoringNoClipRect).Min.y = (pIVar23->NavScoringNoClipRect).Min.y + fVar60;
    (pIVar23->NavScoringNoClipRect).Max.y = (pIVar23->NavScoringNoClipRect).Max.y + fVar60;
  }
  pIVar23->NavMoveForwardToNextFrame = false;
  if (pIVar23->NavMoveDir != -1) {
    NavMoveRequestSubmit
              (pIVar23->NavMoveDir,pIVar23->NavMoveClipDir,pIVar23->NavMoveFlags,
               pIVar23->NavMoveScrollFlags);
  }
  if ((pIVar23->NavMoveSubmitted == true) && (pIVar23->NavId == 0)) {
    if ((pIVar23->DebugLogFlags & 8) != 0) {
      if (pIVar36 == (ImGuiWindow *)0x0) {
        pcVar49 = "<NULL>";
      }
      else {
        pcVar49 = pIVar36->Name;
      }
      DebugLog("[nav] NavInitRequest: from move, window \"%s\", layer=%d\n",pcVar49,
               (ulong)pIVar23->NavLayer);
    }
    pIVar23->NavInitRequest = true;
    pIVar23->NavInitRequestFromMove = true;
    pIVar23->NavInitResultId = 0;
    pIVar23->NavDisableHighlight = false;
  }
  if (((pIVar23->NavMoveSubmitted == true) && (pIVar23->NavInputSource == ImGuiInputSource_Gamepad))
     && (uVar42 = (ulong)pIVar23->NavLayer, uVar42 == 0 && pIVar36 != (ImGuiWindow *)0x0)) {
    auVar70._0_4_ = -(uint)((pIVar23->NavMoveFlags & 5U) == 0);
    auVar70._4_4_ = -(uint)((pIVar23->NavMoveFlags & 10U) == 0);
    auVar70._8_4_ = 0xffffffff;
    auVar70._12_4_ = 0xffffffff;
    IVar64 = (pIVar36->DC).CursorStartPos;
    IVar62 = (pIVar36->InnerRect).Min;
    IVar68 = (pIVar36->InnerRect).Max;
    fVar76 = IVar64.x;
    local_88.Min.x = (IVar62.x + -1.0) - fVar76;
    fVar84 = IVar64.y;
    local_88.Min.y = (IVar62.y + -1.0) - fVar84;
    local_88.Max.x = (IVar68.x + 1.0) - fVar76;
    local_88.Max.y = (IVar68.y + 1.0) - fVar84;
    auVar67._4_4_ = auVar70._4_4_;
    auVar67._0_4_ = auVar70._4_4_;
    auVar67._8_4_ = auVar70._4_4_;
    auVar67._12_4_ = auVar70._4_4_;
    if ((((auVar67 | auVar70) & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
       (((pIVar36->NavRectRel[uVar42].Min.x < local_88.Min.x ||
         (pIVar36->NavRectRel[uVar42].Min.y < local_88.Min.y)) ||
        ((local_88.Max.x < pIVar36->NavRectRel[uVar42].Max.x ||
         (local_88.Max.y < pIVar36->NavRectRel[uVar42].Max.y)))))) {
      fVar84 = GImGui->FontBaseSize * pIVar36->FontWindowScale;
      pIVar37 = pIVar36->ParentWindow;
      fVar76 = fVar84;
      if (pIVar37 != (ImGuiWindow *)0x0) {
        fVar76 = pIVar37->FontWindowScale * fVar84;
      }
      fVar78 = local_88.Max.x - local_88.Min.x;
      if (fVar76 * 0.5 <= local_88.Max.x - local_88.Min.x) {
        fVar78 = fVar76 * 0.5;
      }
      if (pIVar37 != (ImGuiWindow *)0x0) {
        fVar84 = fVar84 * pIVar37->FontWindowScale;
      }
      fVar76 = local_88.Max.y - local_88.Min.y;
      if (fVar84 * 0.5 <= local_88.Max.y - local_88.Min.y) {
        fVar76 = fVar84 * 0.5;
      }
      local_88.Min.y =
           (float)(~auVar70._4_4_ & 0xff7fffff | (uint)(local_88.Min.y + fVar76) & auVar70._4_4_);
      local_88.Min.x =
           (float)(~auVar70._0_4_ & 0xff7fffff | (uint)(local_88.Min.x + fVar78) & auVar70._0_4_);
      local_88.Max.y =
           (float)(~auVar70._4_4_ & 0x7f7fffff | (uint)(local_88.Max.y - fVar76) & auVar70._4_4_);
      local_88.Max.x =
           (float)(~auVar70._0_4_ & 0x7f7fffff | (uint)(local_88.Max.x - fVar78) & auVar70._0_4_);
      ImRect::ClipWithFull(pIVar36->NavRectRel + uVar42,&local_88);
      pIVar23->NavId = 0;
    }
  }
  pIVar47 = local_70;
  if (pIVar36 == (ImGuiWindow *)0x0) {
    IVar63.x = 0.0;
    IVar63.y = 0.0;
    IVar73.x = 0.0;
    IVar73.y = 0.0;
  }
  else {
    IVar50 = pIVar23->NavLayer;
    fVar76 = pIVar36->NavRectRel[IVar50].Max.x;
    fVar84 = pIVar36->NavRectRel[IVar50].Min.x;
    fVar78 = pIVar36->NavRectRel[IVar50].Min.y;
    fVar71 = pIVar36->NavRectRel[IVar50].Max.y;
    fVar77 = 0.0;
    fVar83 = 0.0;
    fVar79 = 0.0;
    fVar61 = 0.0;
    if (fVar84 <= fVar76 && fVar78 <= fVar71) {
      fVar77 = fVar71;
      fVar83 = fVar76;
      fVar79 = fVar78;
      fVar61 = fVar84;
    }
    fVar76 = (pIVar36->DC).CursorStartPos.x;
    fVar84 = (pIVar36->DC).CursorStartPos.y;
    fVar83 = fVar83 + fVar76;
    fVar76 = fVar61 + fVar76 + 1.0;
    if (fVar83 <= fVar76) {
      fVar76 = fVar83;
    }
    IVar73.y = fVar79 + fVar84 + fVar60;
    IVar73.x = fVar76;
    IVar63.y = fVar77 + fVar84 + fVar60;
    IVar63.x = fVar76;
  }
  (pIVar23->NavScoringRect).Min = IVar73;
  (pIVar23->NavScoringRect).Max = IVar63;
  if (IVar73.x < (pIVar23->NavScoringNoClipRect).Min.x) {
    (pIVar23->NavScoringNoClipRect).Min.x = IVar73.x;
  }
  if (IVar73.y < (pIVar23->NavScoringNoClipRect).Min.y) {
    (pIVar23->NavScoringNoClipRect).Min.y = IVar73.y;
  }
  pIVar1 = &(pIVar23->NavScoringNoClipRect).Max;
  fVar60 = IVar63.x;
  if (pIVar1->x <= fVar60 && fVar60 != pIVar1->x) {
    (pIVar23->NavScoringNoClipRect).Max.x = fVar60;
  }
  fVar60 = IVar63.y;
  pfVar6 = &(pIVar23->NavScoringNoClipRect).Max.y;
  if (*pfVar6 <= fVar60 && fVar60 != *pfVar6) {
    (pIVar23->NavScoringNoClipRect).Max.y = fVar60;
  }
  pIVar23 = GImGui;
  if (((pIVar22->NavMoveDir == -1) && (pIVar36 = GImGui->NavWindow, pIVar36 != (ImGuiWindow *)0x0))
     && (((GImGui->NavWindowingTarget == (ImGuiWindow *)0x0 &&
          ((((pIVar36->Flags & 0x40000) == 0 &&
            (bVar57 = IsKeyPressed(ImGuiKey_NamedKey_BEGIN,0xffffffff,1), bVar57)) &&
           ((pIVar23->IO).KeyCtrl == false)))) && ((pIVar23->IO).KeyAlt == false)))) {
    uVar39 = 0xffffffff;
    if ((pIVar23->IO).KeyShift == false) {
      uVar39 = (uint)(pIVar23->ActiveId != 0);
    }
    pIVar23->NavTabbingDir = uVar39;
    scroll_flags = 3;
    if (pIVar36->Appearing != false) {
      scroll_flags = 0x21;
    }
    NavMoveRequestSubmit(-1,uVar39 >> 0x1f ^ 3,0x400,scroll_flags);
    pIVar23->NavTabbingCounter = -1;
  }
  pIVar23 = GImGui;
  bVar57 = true;
  if (GImGui->NavMoveScoringItems == false) {
    bVar57 = GImGui->NavInitRequest;
  }
  GImGui->NavAnyRequest = bVar57;
  pIVar22->NavIdIsAlive = false;
  pIVar36 = pIVar22->NavWindow;
  if (((pIVar36 != (ImGuiWindow *)0x0) && ((pIVar36->Flags & 0x40000) == 0)) &&
     (pIVar22->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar60 = pIVar23->FontBaseSize * pIVar36->FontWindowScale;
    if (pIVar36->ParentWindow != (ImGuiWindow *)0x0) {
      fVar60 = fVar60 * pIVar36->ParentWindow->FontWindowScale;
    }
    fVar60 = (float)(int)(fVar60 * 100.0 * (pIVar22->IO).DeltaTime + 0.5);
    if (((pIVar36->DC).NavLayersActiveMask == 0) &&
       (uVar39 = pIVar22->NavMoveDir, (uVar39 != 0xffffffff & (pIVar36->DC).NavHasScroll) == 1)) {
      if (uVar39 < 2) {
        (pIVar36->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_0025c718 + (ulong)(uVar39 == 0) * 4) * fVar60 +
                         (pIVar36->Scroll).x);
        (pIVar36->ScrollTargetCenterRatio).x = 0.0;
        (pIVar36->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((uVar39 & 0xfffffffe) == 2) {
        (pIVar36->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_0025c718 + (ulong)(uVar39 == 2) * 4) * fVar60 +
                         (pIVar36->Scroll).y);
        (pIVar36->ScrollTargetCenterRatio).y = 0.0;
        (pIVar36->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
    if (bVar27 != 0) {
      IVar64 = GetKeyVector2d(ImGuiKey_GamepadLStickLeft,ImGuiKey_GamepadLStickRight,
                              ImGuiKey_GamepadLStickUp,ImGuiKey_GamepadLStickDown);
      bVar57 = IsKeyDown(ImGuiKey_GamepadL1);
      if (bVar57) {
        fVar76 = 0.1;
      }
      else {
        bVar57 = IsKeyDown(ImGuiKey_GamepadR1);
        if (bVar57) {
          fVar76 = 10.0;
        }
        else {
          fVar76 = 1.0;
        }
      }
      local_a8 = IVar64.x;
      fStack_a4 = IVar64.y;
      if (((local_a8 != 0.0) || (NAN(local_a8))) && (pIVar36->ScrollbarX == true)) {
        (pIVar36->ScrollTarget).x = (float)(int)(local_a8 * fVar60 * fVar76 + (pIVar36->Scroll).x);
        (pIVar36->ScrollTargetCenterRatio).x = 0.0;
        (pIVar36->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((fStack_a4 != 0.0) || (NAN(fStack_a4))) {
        (pIVar36->ScrollTarget).y = (float)(int)(fStack_a4 * fVar60 * fVar76 + (pIVar36->Scroll).y);
        (pIVar36->ScrollTargetCenterRatio).y = 0.0;
        (pIVar36->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
  }
  if (((uint)local_68 & 1) == 0) {
    pIVar22->NavDisableHighlight = true;
    pIVar22->NavDisableMouseHover = false;
  }
  else if (((bVar56) && (((pIVar22->IO).ConfigFlags & 4) != 0)) &&
          (((pIVar22->IO).BackendFlags & 4) != 0)) {
    IVar64 = NavCalcPreferredRefPos();
    (pIVar22->IO).MousePosPrev = IVar64;
    (pIVar22->IO).MousePos = IVar64;
    (pIVar22->IO).WantSetMousePos = true;
  }
  pIVar22->NavScoringDebugCount = 0;
  pIVar22 = GImGui;
  fVar60 = (GImGui->IO).MousePos.x;
  if ((-256000.0 <= fVar60) && (fVar76 = (GImGui->IO).MousePos.y, -256000.0 <= fVar76)) {
    if (0.0 <= fVar60) {
LAB_001e97d8:
      iVar41 = (int)fVar60;
    }
    else {
      if ((fVar60 == (float)(int)fVar60) && (!NAN(fVar60) && !NAN((float)(int)fVar60)))
      goto LAB_001e97d8;
      iVar41 = (int)fVar60 + -1;
    }
    if (0.0 <= fVar76) {
LAB_001e97fa:
      iVar52 = (int)fVar76;
    }
    else {
      if ((fVar76 == (float)(int)fVar76) && (!NAN(fVar76) && !NAN((float)(int)fVar76)))
      goto LAB_001e97fa;
      iVar52 = (int)fVar76 + -1;
    }
    IVar65.x = (float)iVar41;
    IVar65.y = (float)iVar52;
    GImGui->MouseLastValidPos = IVar65;
    (pIVar22->IO).MousePos = IVar65;
  }
  IVar64 = (pIVar22->IO).MousePos;
  fVar60 = IVar64.x;
  fVar76 = IVar64.y;
  if ((-256000.0 <= fVar60) && (-256000.0 <= fVar76)) {
    IVar64 = (pIVar22->IO).MousePosPrev;
    fVar84 = IVar64.x;
    if ((-256000.0 <= fVar84) && (fVar78 = IVar64.y, -256000.0 <= fVar78)) {
      IVar80.x = fVar60 - fVar84;
      IVar80.y = fVar76 - fVar78;
      (pIVar22->IO).MouseDelta = IVar80;
      goto LAB_001e9877;
    }
  }
  (pIVar22->IO).MouseDelta.x = 0.0;
  (pIVar22->IO).MouseDelta.y = 0.0;
LAB_001e9877:
  if ((((pIVar22->IO).MouseDelta.x != 0.0) || (fVar60 = (pIVar22->IO).MouseDelta.y, fVar60 != 0.0))
     || (NAN(fVar60))) {
    pIVar22->NavDisableMouseHover = false;
  }
  IVar64 = (pIVar22->IO).MousePos;
  (pIVar22->IO).MousePosPrev = IVar64;
  lVar45 = 0;
  do {
    bVar56 = (pIVar22->IO).MouseDown[lVar45];
    if (bVar56 == true) {
      pfVar6 = (pIVar22->IO).MouseDownDuration + lVar45;
      bVar57 = *pfVar6 <= 0.0 && *pfVar6 != 0.0;
    }
    else {
      bVar57 = false;
    }
    (pIVar22->IO).MouseClicked[lVar45] = bVar57;
    (pIVar22->IO).MouseClickedCount[lVar45] = 0;
    if (bVar56 == false) {
      bVar29 = 0.0 <= (pIVar22->IO).MouseDownDuration[lVar45];
    }
    else {
      bVar29 = false;
    }
    (pIVar22->IO).MouseReleased[lVar45] = bVar29;
    fVar60 = (pIVar22->IO).MouseDownDuration[lVar45];
    (pIVar22->IO).MouseDownDurationPrev[lVar45] = fVar60;
    fVar84 = -1.0;
    if ((bVar56 != false) && (fVar84 = 0.0, 0.0 <= fVar60)) {
      fVar84 = fVar60 + (pIVar22->IO).DeltaTime;
    }
    (pIVar22->IO).MouseDownDuration[lVar45] = fVar84;
    if (bVar57 == false) {
      if (bVar56 != false) {
        fVar60 = (pIVar22->IO).MousePos.x;
        fVar84 = 0.0;
        if ((-256000.0 <= fVar60) && (-256000.0 <= fVar76)) {
          fVar60 = fVar60 - (pIVar22->IO).MouseClickedPos[lVar45].x;
          fVar84 = fVar76 - (pIVar22->IO).MouseClickedPos[lVar45].y;
          fVar84 = fVar60 * fVar60 + fVar84 * fVar84;
        }
        fVar60 = (pIVar22->IO).MouseDragMaxDistanceSqr[lVar45];
        uVar39 = -(uint)(fVar84 <= fVar60);
        (pIVar22->IO).MouseDragMaxDistanceSqr[lVar45] =
             (float)(~uVar39 & (uint)fVar84 | (uint)fVar60 & uVar39);
      }
    }
    else {
      if ((pIVar22->IO).MouseDoubleClickTime <=
          (float)(pIVar22->Time - (pIVar22->IO).MouseClickedTime[lVar45])) {
LAB_001e9a25:
        (pIVar22->IO).MouseClickedLastCount[lVar45] = 1;
      }
      else {
        fVar60 = (pIVar22->IO).MousePos.x;
        fVar84 = 0.0;
        fVar78 = 0.0;
        if ((-256000.0 <= fVar60) && (-256000.0 <= fVar76)) {
          pIVar1 = (pIVar22->IO).MouseClickedPos + lVar45;
          fVar84 = fVar60 - pIVar1->x;
          fVar78 = fVar76 - pIVar1->y;
        }
        fVar60 = (pIVar22->IO).MouseDoubleClickMaxDist;
        if (fVar60 * fVar60 <= fVar84 * fVar84 + fVar78 * fVar78) goto LAB_001e9a25;
        pIVar7 = (pIVar22->IO).MouseClickedLastCount + lVar45;
        *pIVar7 = *pIVar7 + 1;
      }
      (pIVar22->IO).MouseClickedTime[lVar45] = pIVar22->Time;
      (pIVar22->IO).MouseClickedPos[lVar45] = IVar64;
      (pIVar22->IO).MouseClickedCount[lVar45] = (pIVar22->IO).MouseClickedLastCount[lVar45];
      (pIVar22->IO).MouseDragMaxDistanceSqr[lVar45] = 0.0;
    }
    (pIVar22->IO).MouseDoubleClicked[lVar45] = (pIVar22->IO).MouseClickedCount[lVar45] == 2;
    if ((pIVar22->IO).MouseClicked[lVar45] == true) {
      pIVar22->NavDisableMouseHover = false;
    }
    lVar45 = lVar45 + 1;
    if (lVar45 == 5) {
      UpdateHoveredWindowAndCaptureFlags();
      UpdateMouseMovingWindowNewFrame();
      pIVar36 = GetTopMostPopupModal();
      if ((pIVar36 != (ImGuiWindow *)0x0) ||
         ((pIVar47->NavWindowingTarget != (ImGuiWindow *)0x0 &&
          (0.0 < pIVar47->NavWindowingHighlightAlpha)))) {
        fVar60 = (pIVar47->IO).DeltaTime * 6.0 + pIVar47->DimBgRatio;
        if (1.0 <= fVar60) {
          fVar60 = 1.0;
        }
        pIVar47->DimBgRatio = fVar60;
      }
      else {
        fVar60 = (pIVar47->IO).DeltaTime * -10.0 + pIVar47->DimBgRatio;
        pIVar47->DimBgRatio = (float)(-(uint)(0.0 <= fVar60) & (uint)fVar60);
      }
      pIVar47->MouseCursor = 0;
      pIVar47->WantTextInputNextFrame = -1;
      pIVar47->WantCaptureMouseNextFrame = -1;
      pIVar47->WantCaptureKeyboardNextFrame = -1;
      uVar25 = *(undefined3 *)&(pIVar47->PlatformImeData).field_0x1;
      fVar60 = (pIVar47->PlatformImeData).InputPos.x;
      uVar21 = *(undefined8 *)&(pIVar47->PlatformImeData).InputPos.y;
      (pIVar47->PlatformImeDataPrev).WantVisible = (pIVar47->PlatformImeData).WantVisible;
      *(undefined3 *)&(pIVar47->PlatformImeDataPrev).field_0x1 = uVar25;
      (pIVar47->PlatformImeDataPrev).InputPos.x = fVar60;
      *(undefined8 *)&(pIVar47->PlatformImeDataPrev).InputPos.y = uVar21;
      (pIVar47->PlatformImeData).WantVisible = false;
      pIVar22 = GImGui;
      if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
        GImGui->WheelingWindowReleaseTimer =
             GImGui->WheelingWindowReleaseTimer - (GImGui->IO).DeltaTime;
        fVar60 = (pIVar22->IO).MousePos.x;
        if (((-256000.0 <= fVar60) && (fVar76 = (pIVar22->IO).MousePos.y, -256000.0 <= fVar76)) &&
           (fVar60 = fVar60 - (pIVar22->WheelingWindowRefMousePos).x,
           fVar76 = fVar76 - (pIVar22->WheelingWindowRefMousePos).y,
           fVar84 = (pIVar22->IO).MouseDragThreshold,
           fVar84 * fVar84 < fVar60 * fVar60 + fVar76 * fVar76)) {
          pIVar22->WheelingWindowReleaseTimer = 0.0;
        }
        if (pIVar22->WheelingWindowReleaseTimer <= 0.0) {
          LockWheelingWindow((ImGuiWindow *)0x0,0.0);
        }
      }
      fVar76 = 0.0;
      fVar60 = 0.0;
      if (GImGui->KeysOwnerData[0x86].OwnerCurr == 0xffffffff) {
        fVar60 = (pIVar22->IO).MouseWheelH;
      }
      if (GImGui->KeysOwnerData[0x87].OwnerCurr == 0xffffffff) {
        fVar76 = (pIVar22->IO).MouseWheel;
      }
      if (((fVar60 != 0.0) || (fVar76 != 0.0)) || (NAN(fVar76))) {
        pIVar36 = pIVar22->WheelingWindow;
        if (pIVar36 == (ImGuiWindow *)0x0) {
          pIVar36 = pIVar22->HoveredWindow;
        }
        if ((pIVar36 != (ImGuiWindow *)0x0) && (pIVar36->Collapsed == false)) {
          if (((fVar76 == 0.0) && (!NAN(fVar76))) ||
             (((pIVar22->IO).KeyCtrl != true || ((pIVar22->IO).FontAllowUserScaling != true)))) {
            if ((pIVar22->IO).KeyCtrl == false) {
              fVar84 = fVar76;
              if (((pIVar22->IO).KeyShift == true) && ((pIVar22->IO).ConfigMacOSXBehaviors == false)
                 ) {
                fVar84 = 0.0;
                fVar60 = fVar76;
              }
              if ((fVar84 != 0.0) || (NAN(fVar84))) {
                uVar39 = pIVar36->Flags;
                pIVar37 = pIVar36;
                while (((uVar39 >> 0x18 & 1) != 0 &&
                       (((uVar39 & 0x210) == 0x10 ||
                        ((fVar76 = (pIVar37->ScrollMax).y, fVar76 == 0.0 && (!NAN(fVar76)))))))) {
                  pIVar37 = pIVar37->ParentWindow;
                  uVar39 = pIVar37->Flags;
                }
                if ((uVar39 & 0x210) == 0) {
                  LockWheelingWindow(pIVar36,fVar84);
                  fVar76 = ((pIVar37->InnerRect).Max.y - (pIVar37->InnerRect).Min.y) * 0.67;
                  fVar78 = GImGui->FontBaseSize * pIVar37->FontWindowScale;
                  if (pIVar37->ParentWindow != (ImGuiWindow *)0x0) {
                    fVar78 = fVar78 * pIVar37->ParentWindow->FontWindowScale;
                  }
                  fVar71 = fVar78 * 5.0;
                  if (fVar76 <= fVar78 * 5.0) {
                    fVar71 = fVar76;
                  }
                  (pIVar37->ScrollTarget).y = (pIVar37->Scroll).y - fVar84 * (float)(int)fVar71;
                  (pIVar37->ScrollTargetCenterRatio).y = 0.0;
                  (pIVar37->ScrollTargetEdgeSnapDist).y = 0.0;
                }
              }
              if ((fVar60 != 0.0) || (NAN(fVar60))) {
                uVar39 = pIVar36->Flags;
                pIVar37 = pIVar36;
                while (((uVar39 >> 0x18 & 1) != 0 &&
                       (((uVar39 & 0x210) == 0x10 ||
                        ((fVar76 = (pIVar37->ScrollMax).x, fVar76 == 0.0 && (!NAN(fVar76)))))))) {
                  pIVar37 = pIVar37->ParentWindow;
                  uVar39 = pIVar37->Flags;
                }
                if ((uVar39 & 0x210) == 0) {
                  LockWheelingWindow(pIVar36,fVar60);
                  fVar76 = ((pIVar37->InnerRect).Max.x - (pIVar37->InnerRect).Min.x) * 0.67;
                  fVar84 = GImGui->FontBaseSize * pIVar37->FontWindowScale;
                  if (pIVar37->ParentWindow != (ImGuiWindow *)0x0) {
                    fVar84 = fVar84 * pIVar37->ParentWindow->FontWindowScale;
                  }
                  fVar78 = fVar84 + fVar84;
                  if (fVar76 <= fVar84 + fVar84) {
                    fVar78 = fVar76;
                  }
                  (pIVar37->ScrollTarget).x = (pIVar37->Scroll).x - fVar60 * (float)(int)fVar78;
                  (pIVar37->ScrollTargetCenterRatio).x = 0.0;
                  (pIVar37->ScrollTargetEdgeSnapDist).x = 0.0;
                }
              }
            }
          }
          else {
            LockWheelingWindow(pIVar36,fVar76);
            fVar60 = pIVar36->FontWindowScale;
            fVar84 = (pIVar22->IO).MouseWheel * 0.1 + fVar60;
            fVar76 = 2.5;
            if (fVar84 <= 2.5) {
              fVar76 = fVar84;
            }
            fVar76 = (float)(-(uint)(fVar84 < 0.5) & 0x3f000000 |
                            ~-(uint)(fVar84 < 0.5) & (uint)fVar76);
            pIVar36->FontWindowScale = fVar76;
            if (pIVar36 == pIVar36->RootWindow) {
              fVar76 = fVar76 / fVar60;
              IVar64 = pIVar36->Size;
              auVar75._8_8_ = 0;
              auVar75._0_4_ = IVar64.x;
              auVar75._4_4_ = IVar64.y;
              IVar62 = (pIVar22->IO).MousePos;
              fVar60 = (pIVar36->Pos).x;
              fVar84 = (pIVar36->Pos).y;
              auVar81._0_4_ = (IVar62.x - fVar60) * (1.0 - fVar76) * IVar64.x;
              auVar81._4_4_ = (IVar62.y - fVar84) * (1.0 - fVar76) * IVar64.y;
              auVar81._8_8_ = 0;
              auVar82 = divps(auVar81,auVar75);
              local_88.Min.x = auVar82._0_4_ + fVar60;
              local_88.Min.y = auVar82._4_4_ + fVar84;
              SetWindowPos(pIVar36,&local_88.Min,0);
              IVar64 = pIVar36->SizeFull;
              IVar66.x = (float)(int)((pIVar36->Size).x * fVar76);
              IVar66.y = (float)(int)((pIVar36->Size).y * fVar76);
              pIVar36->Size = IVar66;
              (pIVar36->SizeFull).x = (float)(int)(IVar64.x * fVar76);
              (pIVar36->SizeFull).y = (float)(int)(IVar64.y * fVar76);
            }
          }
        }
      }
      local_b8 = 3.4028235e+38;
      if ((pIVar47->GcCompactAll == false) &&
         (fVar60 = (pIVar47->IO).ConfigMemoryCompactTimer, 0.0 <= fVar60)) {
        local_b8 = (float)pIVar47->Time - fVar60;
      }
      if ((pIVar47->Windows).Size != 0) {
        uVar42 = 0;
        do {
          pIVar36 = (pIVar47->Windows).Data[uVar42];
          bVar56 = pIVar36->Active;
          pIVar36->WasActive = bVar56;
          pIVar36->Active = false;
          pIVar36->WriteAccessed = false;
          pIVar36->BeginCountPreviousFrame = pIVar36->BeginCount;
          pIVar36->BeginCount = 0;
          if (((bVar56 == false) && (pIVar36->MemoryCompacted == false)) &&
             (pIVar36->LastTimeActive <= local_b8 && local_b8 != pIVar36->LastTimeActive)) {
            GcCompactTransientWindowBuffers(pIVar36);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != (uint)(pIVar47->Windows).Size);
      }
      if (0 < (pIVar47->TablesLastTimeActive).Size) {
        lVar45 = 0;
        lVar55 = 0;
        do {
          fVar60 = (pIVar47->TablesLastTimeActive).Data[lVar55];
          if ((0.0 <= fVar60) && (fVar60 < local_b8)) {
            TableGcCompactTransientBuffers
                      ((ImGuiTable *)((long)&((pIVar47->Tables).Buf.Data)->ID + lVar45));
          }
          lVar55 = lVar55 + 1;
          lVar45 = lVar45 + 0x218;
        } while (lVar55 < (pIVar47->TablesLastTimeActive).Size);
      }
      if (0 < (pIVar47->TablesTempData).Size) {
        lVar45 = 0;
        lVar55 = 0;
        do {
          pIVar15 = (pIVar47->TablesTempData).Data;
          fVar60 = *(float *)((long)&pIVar15->LastTimeActive + lVar45);
          if ((0.0 <= fVar60) && (fVar60 < local_b8)) {
            TableGcCompactTransientBuffers
                      ((ImGuiTableTempData *)((long)&pIVar15->TableIndex + lVar45));
          }
          lVar55 = lVar55 + 1;
          lVar45 = lVar45 + 0x70;
        } while (lVar55 < (pIVar47->TablesTempData).Size);
      }
      if (pIVar47->GcCompactAll != false) {
        GcCompactTransientMiscBuffers();
      }
      pIVar47->GcCompactAll = false;
      if ((pIVar47->NavWindow != (ImGuiWindow *)0x0) && (pIVar47->NavWindow->WasActive == false)) {
        FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
      }
      iVar41 = (pIVar47->CurrentWindowStack).Capacity;
      if (iVar41 < 0) {
        uVar39 = iVar41 / 2 + iVar41;
        uVar42 = 0;
        if (0 < (int)uVar39) {
          uVar42 = (ulong)uVar39;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar18 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar18 = *piVar18 + 1;
        }
        __dest_02 = (ImGuiWindowStackData *)
                    (*GImAllocatorAllocFunc)(uVar42 * 0x58,GImAllocatorUserData);
        pIVar16 = (pIVar47->CurrentWindowStack).Data;
        if (pIVar16 != (ImGuiWindowStackData *)0x0) {
          memcpy(__dest_02,pIVar16,(long)(pIVar47->CurrentWindowStack).Size * 0x58);
          pIVar16 = (pIVar47->CurrentWindowStack).Data;
          if ((pIVar16 != (ImGuiWindowStackData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar18 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar18 = *piVar18 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar16,GImAllocatorUserData);
        }
        (pIVar47->CurrentWindowStack).Data = __dest_02;
        (pIVar47->CurrentWindowStack).Capacity = (int)uVar42;
      }
      (pIVar47->CurrentWindowStack).Size = 0;
      iVar41 = (pIVar47->BeginPopupStack).Capacity;
      if (iVar41 < 0) {
        uVar39 = iVar41 / 2 + iVar41;
        uVar42 = 0;
        if (0 < (int)uVar39) {
          uVar42 = (ulong)uVar39;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar18 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar18 = *piVar18 + 1;
        }
        __dest_03 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(uVar42 * 0x38,GImAllocatorUserData);
        pIVar17 = (pIVar47->BeginPopupStack).Data;
        if (pIVar17 != (ImGuiPopupData *)0x0) {
          memcpy(__dest_03,pIVar17,(long)(pIVar47->BeginPopupStack).Size * 0x38);
          pIVar17 = (pIVar47->BeginPopupStack).Data;
          if ((pIVar17 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar18 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar18 = *piVar18 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar17,GImAllocatorUserData);
        }
        (pIVar47->BeginPopupStack).Data = __dest_03;
        (pIVar47->BeginPopupStack).Capacity = (int)uVar42;
      }
      (pIVar47->BeginPopupStack).Size = 0;
      iVar41 = (pIVar47->ItemFlagsStack).Capacity;
      if (iVar41 < 0) {
        uVar39 = iVar41 / 2 + iVar41;
        uVar42 = 0;
        if (0 < (int)uVar39) {
          uVar42 = (ulong)uVar39;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar18 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar18 = *piVar18 + 1;
        }
        piVar38 = (int *)(*GImAllocatorAllocFunc)(uVar42 * 4,GImAllocatorUserData);
        piVar18 = (pIVar47->ItemFlagsStack).Data;
        if (piVar18 != (int *)0x0) {
          memcpy(piVar38,piVar18,(long)(pIVar47->ItemFlagsStack).Size << 2);
          piVar18 = (pIVar47->ItemFlagsStack).Data;
          if ((piVar18 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar3 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar3 = *piVar3 + -1;
          }
          (*GImAllocatorFreeFunc)(piVar18,GImAllocatorUserData);
        }
        (pIVar47->ItemFlagsStack).Data = piVar38;
        (pIVar47->ItemFlagsStack).Capacity = (int)uVar42;
      }
      (pIVar47->ItemFlagsStack).Size = 0;
      if ((pIVar47->ItemFlagsStack).Capacity == 0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar18 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar18 = *piVar18 + 1;
        }
        piVar38 = (int *)(*GImAllocatorAllocFunc)(0x20,GImAllocatorUserData);
        piVar18 = (pIVar47->ItemFlagsStack).Data;
        if (piVar18 != (int *)0x0) {
          memcpy(piVar38,piVar18,(long)(pIVar47->ItemFlagsStack).Size << 2);
          piVar18 = (pIVar47->ItemFlagsStack).Data;
          if ((piVar18 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar3 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar3 = *piVar3 + -1;
          }
          (*GImAllocatorFreeFunc)(piVar18,GImAllocatorUserData);
        }
        (pIVar47->ItemFlagsStack).Data = piVar38;
        (pIVar47->ItemFlagsStack).Capacity = 8;
      }
      (pIVar47->ItemFlagsStack).Data[(pIVar47->ItemFlagsStack).Size] = 0;
      (pIVar47->ItemFlagsStack).Size = (pIVar47->ItemFlagsStack).Size + 1;
      iVar41 = (pIVar47->GroupStack).Capacity;
      if (iVar41 < 0) {
        uVar39 = iVar41 / 2 + iVar41;
        uVar42 = 0;
        if (0 < (int)uVar39) {
          uVar42 = (ulong)uVar39;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar18 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar18 = *piVar18 + 1;
        }
        __dest_04 = (ImGuiGroupData *)(*GImAllocatorAllocFunc)(uVar42 * 0x30,GImAllocatorUserData);
        pIVar19 = (pIVar47->GroupStack).Data;
        if (pIVar19 != (ImGuiGroupData *)0x0) {
          memcpy(__dest_04,pIVar19,(long)(pIVar47->GroupStack).Size * 0x30);
          pIVar19 = (pIVar47->GroupStack).Data;
          if ((pIVar19 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar18 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar18 = *piVar18 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar19,GImAllocatorUserData);
        }
        (pIVar47->GroupStack).Data = __dest_04;
        (pIVar47->GroupStack).Capacity = (int)uVar42;
      }
      (pIVar47->GroupStack).Size = 0;
      pIVar22 = GImGui;
      GImGui->DebugItemPickerBreakId = 0;
      if (pIVar22->DebugItemPickerActive == true) {
        IVar44 = pIVar22->HoveredIdPreviousFrame;
        pIVar22->MouseCursor = 7;
        bVar56 = IsKeyPressed(ImGuiKey_Escape,0,1);
        if (bVar56) {
          pIVar22->DebugItemPickerActive = false;
        }
        iVar41 = (pIVar22->IO).KeyMods;
        if (iVar41 != 0x3000) {
          bVar27 = pIVar22->DebugItemPickerMouseButton;
          if ((((pIVar22->IO).MouseDown[bVar27] != true) ||
              (fVar60 = (pIVar22->IO).MouseDownDuration[bVar27], fVar60 != 0.0)) || (NAN(fVar60))) {
            bVar56 = false;
          }
          else {
            bVar56 = TestKeyOwner(bVar27 + ImGuiKey_MouseLeft,0);
          }
          if ((IVar44 != 0 & bVar56) == 1) {
            pIVar22->DebugItemPickerBreakId = IVar44;
            pIVar22->DebugItemPickerActive = false;
          }
        }
        lVar45 = 0;
        do {
          if (((iVar41 == 0x3000) && ((pIVar22->IO).MouseDown[lVar45] == true)) &&
             ((fVar60 = (pIVar22->IO).MouseDownDuration[lVar45], fVar60 == 0.0 &&
              ((!NAN(fVar60) && (bVar56 = TestKeyOwner((int)lVar45 + ImGuiKey_MouseLeft,0), bVar56))
              )))) {
            pIVar22->DebugItemPickerMouseButton = (ImU8)lVar45;
          }
          lVar45 = lVar45 + 1;
        } while (lVar45 != 3);
        *(byte *)&(pIVar22->NextWindowData).Flags = (byte)(pIVar22->NextWindowData).Flags | 0x40;
        (pIVar22->NextWindowData).BgAlphaVal = 0.7;
        BeginTooltipEx(0,0);
        Text("HoveredId: 0x%08X");
        Text("Press ESC to abort picking.");
        if (iVar41 == 0x3000) {
          Text("Remap w/ Ctrl+Shift: click anywhere to select new mouse button.");
        }
        else {
          TextColored((GImGui->Style).Colors + (IVar44 == 0),
                      "Click %s Button to break in debugger! (remap w/ Ctrl+Shift)",
                      &DAT_0025c62c +
                      *(int *)(&DAT_0025c62c + (ulong)pIVar22->DebugItemPickerMouseButton * 4));
        }
        pIVar47 = local_70;
        End();
      }
      pIVar22 = GImGui;
      GImGui->DebugHookIdInfo = 0;
      if (pIVar22->FrameCount == (pIVar22->DebugStackTool).LastActiveFrame + 1) {
        IVar44 = pIVar22->HoveredIdPreviousFrame;
        if (IVar44 == 0) {
          IVar44 = pIVar22->ActiveId;
        }
        if ((pIVar22->DebugStackTool).QueryId != IVar44) {
          (pIVar22->DebugStackTool).QueryId = IVar44;
          (pIVar22->DebugStackTool).StackLevel = -1;
          iVar41 = (pIVar22->DebugStackTool).Results.Capacity;
          if (iVar41 < 0) {
            uVar39 = iVar41 / 2 + iVar41;
            uVar42 = 0;
            if (0 < (int)uVar39) {
              uVar42 = (ulong)uVar39;
            }
            if (pIVar22 != (ImGuiContext *)0x0) {
              piVar18 = &(pIVar22->IO).MetricsActiveAllocations;
              *piVar18 = *piVar18 + 1;
            }
            __dest_05 = (ImGuiStackLevelInfo *)
                        (*GImAllocatorAllocFunc)(uVar42 << 6,GImAllocatorUserData);
            pIVar20 = (pIVar22->DebugStackTool).Results.Data;
            if (pIVar20 != (ImGuiStackLevelInfo *)0x0) {
              memcpy(__dest_05,pIVar20,(long)(pIVar22->DebugStackTool).Results.Size << 6);
              pIVar20 = (pIVar22->DebugStackTool).Results.Data;
              if ((pIVar20 != (ImGuiStackLevelInfo *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                piVar18 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar18 = *piVar18 + -1;
              }
              (*GImAllocatorFreeFunc)(pIVar20,GImAllocatorUserData);
            }
            (pIVar22->DebugStackTool).Results.Data = __dest_05;
            (pIVar22->DebugStackTool).Results.Capacity = (int)uVar42;
          }
          (pIVar22->DebugStackTool).Results.Size = 0;
        }
        if (IVar44 != 0) {
          iVar41 = (pIVar22->DebugStackTool).StackLevel;
          lVar45 = (long)iVar41;
          if (((-1 < lVar45) && (iVar41 < (pIVar22->DebugStackTool).Results.Size)) &&
             ((pIVar20 = (pIVar22->DebugStackTool).Results.Data,
              pIVar20[lVar45].QuerySuccess != false || ('\x02' < pIVar20[lVar45].QueryFrameCount))))
          {
            (pIVar22->DebugStackTool).StackLevel = iVar41 + 1;
          }
          uVar39 = (pIVar22->DebugStackTool).StackLevel;
          uVar42 = (ulong)uVar39;
          if (uVar42 == 0xffffffff) {
            pIVar22->DebugHookIdInfo = IVar44;
          }
          if ((-1 < (int)uVar39) && ((int)uVar39 < (pIVar22->DebugStackTool).Results.Size)) {
            pIVar20 = (pIVar22->DebugStackTool).Results.Data;
            pIVar22->DebugHookIdInfo = pIVar20[uVar42].ID;
            pIVar4 = &pIVar20[uVar42].QueryFrameCount;
            *pIVar4 = *pIVar4 + '\x01';
          }
        }
      }
      if ((pIVar47->DebugLocateFrames != '\0') &&
         (IVar31 = pIVar47->DebugLocateFrames + 0xff, pIVar47->DebugLocateFrames = IVar31,
         IVar31 == '\0')) {
        pIVar47->DebugLocateId = 0;
      }
      pIVar47->WithinFrameScopeWithImplicitWindow = true;
      pIVar22 = GImGui;
      (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
      (pIVar22->NextWindowData).SizeVal.x = 400.0;
      (pIVar22->NextWindowData).SizeVal.y = 400.0;
      (pIVar22->NextWindowData).SizeCond = 4;
      Begin("Debug##Default",(bool *)0x0,0);
      if (0 < (pIVar47->Hooks).Size) {
        lVar45 = 0;
        lVar55 = 0;
        do {
          pIVar10 = (pIVar47->Hooks).Data;
          if (*(int *)(pIVar10 + lVar45 + 4) == 1) {
            (**(code **)(pIVar10 + lVar45 + 0x10))(pIVar47,pIVar10 + lVar45);
          }
          lVar55 = lVar55 + 1;
          lVar45 = lVar45 + 0x20;
        } while (lVar55 < (pIVar47->Hooks).Size);
      }
      return;
    }
  } while( true );
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdDisabled = false;

    // Clear ActiveID if the item is not alive anymore.
    // In 1.87, the common most call to KeepAliveID() was moved from GetID() to ItemAdd().
    // As a result, custom widget using ButtonBehavior() _without_ ItemAdd() need to call KeepAliveID() themselves.
    if (g.ActiveId != 0 && g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId)
    {
        IMGUI_DEBUG_LOG_ACTIVEID("NewFrame(): ClearActiveID() because it isn't marked alive anymore!\n");
        ClearActiveID();
    }

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingAllKeyboardKeys = false;
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
        g.ActiveIdUsingNavInputMask = 0x00;
#endif
    }

#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    if (g.ActiveId == 0)
        g.ActiveIdUsingNavInputMask = 0;
    else if (g.ActiveIdUsingNavInputMask != 0)
    {
        // If your custom widget code used:                 { g.ActiveIdUsingNavInputMask |= (1 << ImGuiNavInput_Cancel); }
        // Since IMGUI_VERSION_NUM >= 18804 it should be:   { SetKeyOwner(ImGuiKey_Escape, g.ActiveId); SetKeyOwner(ImGuiKey_NavGamepadCancel, g.ActiveId); }
        if (g.ActiveIdUsingNavInputMask & (1 << ImGuiNavInput_Cancel))
            SetKeyOwner(ImGuiKey_Escape, g.ActiveId);
        if (g.ActiveIdUsingNavInputMask & ~(1 << ImGuiNavInput_Cancel))
            IM_ASSERT(0); // Other values unsupported
    }
#endif

    // Update hover delay for IsItemHovered() with delays and tooltips
    g.HoverDelayIdPreviousFrame = g.HoverDelayId;
    if (g.HoverDelayId != 0)
    {
        //if (g.IO.MouseDelta.x == 0.0f && g.IO.MouseDelta.y == 0.0f) // Need design/flags
        g.HoverDelayTimer += g.IO.DeltaTime;
        g.HoverDelayClearTimer = 0.0f;
        g.HoverDelayId = 0;
    }
    else if (g.HoverDelayTimer > 0.0f)
    {
        // This gives a little bit of leeway before clearing the hover timer, allowing mouse to cross gaps
        g.HoverDelayClearTimer += g.IO.DeltaTime;
        if (g.HoverDelayClearTimer >= ImMax(0.20f, g.IO.DeltaTime * 2.0f)) // ~6 frames at 30 Hz + allow for low framerate
            g.HoverDelayTimer = g.HoverDelayClearTimer = 0.0f; // May want a decaying timer, in which case need to clamp at max first, based on max of caller last requested timer.
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Process input queue (trickle as many events as possible)
    g.InputEventsTrail.resize(0);
    UpdateInputEvents(g.IO.ConfigInputTrickleEventQueue);

    // Update keyboard input state
    UpdateKeyboardInputs();

    //IM_ASSERT(g.IO.KeyCtrl == IsKeyDown(ImGuiKey_LeftCtrl) || IsKeyDown(ImGuiKey_RightCtrl));
    //IM_ASSERT(g.IO.KeyShift == IsKeyDown(ImGuiKey_LeftShift) || IsKeyDown(ImGuiKey_RightShift));
    //IM_ASSERT(g.IO.KeyAlt == IsKeyDown(ImGuiKey_LeftAlt) || IsKeyDown(ImGuiKey_RightAlt));
    //IM_ASSERT(g.IO.KeySuper == IsKeyDown(ImGuiKey_LeftSuper) || IsKeyDown(ImGuiKey_RightSuper));

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;

    // Platform IME data: reset for the frame
    g.PlatformImeDataPrev = g.PlatformImeData;
    g.PlatformImeData.WantVisible = false;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->Active = false;
        window->WriteAccessed = false;
        window->BeginCountPreviousFrame = window->BeginCount;
        window->BeginCount = 0;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();
    if (g.DebugLocateFrames > 0 && --g.DebugLocateFrames == 0)
        g.DebugLocateId = 0;

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it prevents ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}